

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::sse2::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  Primitive *pPVar3;
  Primitive PVar4;
  undefined4 uVar5;
  int iVar6;
  Geometry *pGVar7;
  undefined8 uVar8;
  float *pfVar9;
  undefined1 auVar10 [16];
  undefined6 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  undefined8 uVar31;
  RTCFilterFunctionN p_Var32;
  RTCRayN *pRVar33;
  undefined1 (*pauVar34) [16];
  byte bVar35;
  int iVar36;
  RTCIntersectArguments *pRVar37;
  ulong uVar38;
  Geometry *pGVar39;
  long lVar40;
  Geometry *geometry;
  long lVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined4 uVar46;
  undefined8 unaff_R14;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  float fVar52;
  float fVar80;
  float fVar82;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar62 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  float fVar53;
  float fVar81;
  float fVar83;
  float fVar84;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  short sVar85;
  float fVar86;
  float fVar87;
  float fVar111;
  float fVar113;
  vfloat4 v_1;
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar112;
  float fVar114;
  float fVar115;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar116;
  float fVar124;
  float fVar127;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar117;
  float fVar118;
  float fVar125;
  float fVar126;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar132;
  float fVar133;
  float fVar141;
  float fVar143;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar147;
  float fVar148;
  float fVar160;
  float fVar162;
  vfloat4 v;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar165;
  float fVar166;
  float fVar175;
  float fVar177;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  float fVar176;
  float fVar178;
  float fVar179;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar180;
  float fVar181;
  float fVar198;
  float fVar200;
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar188 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar199;
  float fVar201;
  float fVar202;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar203;
  float fVar204;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar207;
  float fVar213;
  float fVar218;
  float fVar219;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar217;
  float fVar220;
  float fVar223;
  float fVar224;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar235 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar253;
  float fVar256;
  undefined1 auVar245 [16];
  float fVar259;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar248;
  float fVar254;
  float fVar257;
  float fVar260;
  undefined1 auVar249 [16];
  float fVar255;
  float fVar258;
  float fVar261;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar250;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar262;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar272;
  float fVar275;
  float fVar276;
  float fVar277;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar278;
  float fVar279;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  float fVar285;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float local_478;
  float fStack_474;
  float fStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  float local_418;
  float fStack_414;
  float fStack_410;
  undefined1 local_3b8 [16];
  ulong local_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 (*local_338) [16];
  Precalculations *local_330;
  RTCFilterFunctionNArguments args;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_4> bhit;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined2 uVar79;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 uVar110;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  
  PVar4 = prim[1];
  uVar43 = (ulong)(byte)PVar4;
  pPVar3 = prim + uVar43 * 0x19 + 6;
  fVar143 = *(float *)(pPVar3 + 0xc);
  uVar46 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar147 = (*(float *)(ray + k * 4) - *(float *)pPVar3) * fVar143;
  fVar160 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar3 + 4)) * fVar143;
  fVar162 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar3 + 8)) * fVar143;
  fVar132 = *(float *)(ray + k * 4 + 0x40) * fVar143;
  fVar141 = *(float *)(ray + k * 4 + 0x50) * fVar143;
  fVar143 = *(float *)(ray + k * 4 + 0x60) * fVar143;
  uVar5 = *(undefined4 *)(prim + uVar43 * 4 + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar45;
  auVar90._12_2_ = uVar79;
  auVar90._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar45;
  auVar89._10_2_ = uVar79;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar79;
  auVar88._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar12._4_8_ = auVar88._8_8_;
  auVar12._2_2_ = uVar79;
  auVar12._0_2_ = uVar79;
  fVar116 = (float)((int)sVar85 >> 8);
  fVar124 = (float)(auVar12._0_4_ >> 0x18);
  fVar127 = (float)(auVar88._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 5 + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar45;
  auVar93._12_2_ = uVar79;
  auVar93._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar45;
  auVar92._10_2_ = uVar79;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar79;
  auVar91._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar13._4_8_ = auVar91._8_8_;
  auVar13._2_2_ = uVar79;
  auVar13._0_2_ = uVar79;
  fVar165 = (float)((int)sVar85 >> 8);
  fVar175 = (float)(auVar13._0_4_ >> 0x18);
  fVar177 = (float)(auVar91._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 6 + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar96._8_4_ = 0;
  auVar96._0_8_ = uVar45;
  auVar96._12_2_ = uVar79;
  auVar96._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._8_2_ = 0;
  auVar95._0_8_ = uVar45;
  auVar95._10_2_ = uVar79;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._8_2_ = uVar79;
  auVar94._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar14._4_8_ = auVar94._8_8_;
  auVar14._2_2_ = uVar79;
  auVar14._0_2_ = uVar79;
  fVar213 = (float)((int)sVar85 >> 8);
  fVar218 = (float)(auVar14._0_4_ >> 0x18);
  fVar219 = (float)(auVar94._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 0xb + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar99._8_4_ = 0;
  auVar99._0_8_ = uVar45;
  auVar99._12_2_ = uVar79;
  auVar99._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar98._12_4_ = auVar99._12_4_;
  auVar98._8_2_ = 0;
  auVar98._0_8_ = uVar45;
  auVar98._10_2_ = uVar79;
  auVar97._10_6_ = auVar98._10_6_;
  auVar97._8_2_ = uVar79;
  auVar97._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar15._4_8_ = auVar97._8_8_;
  auVar15._2_2_ = uVar79;
  auVar15._0_2_ = uVar79;
  fVar52 = (float)((int)sVar85 >> 8);
  fVar80 = (float)(auVar15._0_4_ >> 0x18);
  fVar82 = (float)(auVar97._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 0xc + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar45;
  auVar184._12_2_ = uVar79;
  auVar184._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar45;
  auVar183._10_2_ = uVar79;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar79;
  auVar182._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar16._4_8_ = auVar182._8_8_;
  auVar16._2_2_ = uVar79;
  auVar16._0_2_ = uVar79;
  fVar203 = (float)((int)sVar85 >> 8);
  fVar208 = (float)(auVar16._0_4_ >> 0x18);
  fVar210 = (float)(auVar182._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 0xd + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar187._8_4_ = 0;
  auVar187._0_8_ = uVar45;
  auVar187._12_2_ = uVar79;
  auVar187._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar186._12_4_ = auVar187._12_4_;
  auVar186._8_2_ = 0;
  auVar186._0_8_ = uVar45;
  auVar186._10_2_ = uVar79;
  auVar185._10_6_ = auVar186._10_6_;
  auVar185._8_2_ = uVar79;
  auVar185._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar17._4_8_ = auVar185._8_8_;
  auVar17._2_2_ = uVar79;
  auVar17._0_2_ = uVar79;
  fVar226 = (float)((int)sVar85 >> 8);
  fVar228 = (float)(auVar17._0_4_ >> 0x18);
  fVar230 = (float)(auVar185._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 0x12 + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar190._8_4_ = 0;
  auVar190._0_8_ = uVar45;
  auVar190._12_2_ = uVar79;
  auVar190._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar189._12_4_ = auVar190._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar45;
  auVar189._10_2_ = uVar79;
  auVar188._10_6_ = auVar189._10_6_;
  auVar188._8_2_ = uVar79;
  auVar188._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar18._4_8_ = auVar188._8_8_;
  auVar18._2_2_ = uVar79;
  auVar18._0_2_ = uVar79;
  fVar220 = (float)((int)sVar85 >> 8);
  fVar223 = (float)(auVar18._0_4_ >> 0x18);
  fVar224 = (float)(auVar188._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 0x13 + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar45;
  auVar193._12_2_ = uVar79;
  auVar193._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar45;
  auVar192._10_2_ = uVar79;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar79;
  auVar191._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar19._4_8_ = auVar191._8_8_;
  auVar19._2_2_ = uVar79;
  auVar19._0_2_ = uVar79;
  fVar233 = (float)((int)sVar85 >> 8);
  fVar236 = (float)(auVar19._0_4_ >> 0x18);
  fVar238 = (float)(auVar191._8_4_ >> 0x18);
  fVar240 = (float)(auVar192._12_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar43 * 0x14 + 6);
  uVar110 = (undefined1)((uint)uVar5 >> 0x18);
  uVar79 = CONCAT11(uVar110,uVar110);
  uVar110 = (undefined1)((uint)uVar5 >> 0x10);
  uVar8 = CONCAT35(CONCAT21(uVar79,uVar110),CONCAT14(uVar110,uVar5));
  uVar110 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar110),uVar110);
  sVar85 = CONCAT11((char)uVar5,(char)uVar5);
  uVar45 = CONCAT62(uVar11,sVar85);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar45;
  auVar247._12_2_ = uVar79;
  auVar247._14_2_ = uVar79;
  uVar79 = (undefined2)((ulong)uVar8 >> 0x20);
  auVar246._12_4_ = auVar247._12_4_;
  auVar246._8_2_ = 0;
  auVar246._0_8_ = uVar45;
  auVar246._10_2_ = uVar79;
  auVar245._10_6_ = auVar246._10_6_;
  auVar245._8_2_ = uVar79;
  auVar245._0_8_ = uVar45;
  uVar79 = (undefined2)uVar11;
  auVar20._4_8_ = auVar245._8_8_;
  auVar20._2_2_ = uVar79;
  auVar20._0_2_ = uVar79;
  fVar86 = (float)((int)sVar85 >> 8);
  fVar111 = (float)(auVar20._0_4_ >> 0x18);
  fVar113 = (float)(auVar245._8_4_ >> 0x18);
  fVar262 = fVar132 * fVar116 + fVar141 * fVar165 + fVar143 * fVar213;
  fVar269 = fVar132 * fVar124 + fVar141 * fVar175 + fVar143 * fVar218;
  fVar270 = fVar132 * fVar127 + fVar141 * fVar177 + fVar143 * fVar219;
  fVar271 = fVar132 * (float)(auVar89._12_4_ >> 0x18) +
            fVar141 * (float)(auVar92._12_4_ >> 0x18) + fVar143 * (float)(auVar95._12_4_ >> 0x18);
  fVar242 = fVar132 * fVar52 + fVar141 * fVar203 + fVar143 * fVar226;
  fVar253 = fVar132 * fVar80 + fVar141 * fVar208 + fVar143 * fVar228;
  fVar256 = fVar132 * fVar82 + fVar141 * fVar210 + fVar143 * fVar230;
  fVar259 = fVar132 * (float)(auVar98._12_4_ >> 0x18) +
            fVar141 * (float)(auVar183._12_4_ >> 0x18) + fVar143 * (float)(auVar186._12_4_ >> 0x18);
  fVar180 = fVar132 * fVar220 + fVar141 * fVar233 + fVar143 * fVar86;
  fVar198 = fVar132 * fVar223 + fVar141 * fVar236 + fVar143 * fVar111;
  fVar200 = fVar132 * fVar224 + fVar141 * fVar238 + fVar143 * fVar113;
  fVar132 = fVar132 * (float)(auVar189._12_4_ >> 0x18) +
            fVar141 * fVar240 + fVar143 * (float)(auVar246._12_4_ >> 0x18);
  fVar165 = fVar116 * fVar147 + fVar165 * fVar160 + fVar213 * fVar162;
  fVar175 = fVar124 * fVar147 + fVar175 * fVar160 + fVar218 * fVar162;
  fVar177 = fVar127 * fVar147 + fVar177 * fVar160 + fVar219 * fVar162;
  fVar213 = (float)(auVar89._12_4_ >> 0x18) * fVar147 +
            (float)(auVar92._12_4_ >> 0x18) * fVar160 + (float)(auVar95._12_4_ >> 0x18) * fVar162;
  fVar218 = fVar52 * fVar147 + fVar203 * fVar160 + fVar226 * fVar162;
  fVar219 = fVar80 * fVar147 + fVar208 * fVar160 + fVar228 * fVar162;
  fVar226 = fVar82 * fVar147 + fVar210 * fVar160 + fVar230 * fVar162;
  fVar228 = (float)(auVar98._12_4_ >> 0x18) * fVar147 +
            (float)(auVar183._12_4_ >> 0x18) * fVar160 + (float)(auVar186._12_4_ >> 0x18) * fVar162;
  fVar203 = fVar147 * fVar220 + fVar160 * fVar233 + fVar162 * fVar86;
  fVar208 = fVar147 * fVar223 + fVar160 * fVar236 + fVar162 * fVar111;
  fVar210 = fVar147 * fVar224 + fVar160 * fVar238 + fVar162 * fVar113;
  fVar147 = fVar147 * (float)(auVar189._12_4_ >> 0x18) +
            fVar160 * fVar240 + fVar162 * (float)(auVar246._12_4_ >> 0x18);
  fVar143 = (float)DAT_01f4bd50;
  fVar52 = DAT_01f4bd50._4_4_;
  fVar80 = DAT_01f4bd50._8_4_;
  fVar82 = DAT_01f4bd50._12_4_;
  uVar47 = -(uint)(fVar143 <= ABS(fVar262));
  uVar48 = -(uint)(fVar52 <= ABS(fVar269));
  uVar49 = -(uint)(fVar80 <= ABS(fVar270));
  uVar50 = -(uint)(fVar82 <= ABS(fVar271));
  auVar263._0_4_ = (uint)fVar262 & uVar47;
  auVar263._4_4_ = (uint)fVar269 & uVar48;
  auVar263._8_4_ = (uint)fVar270 & uVar49;
  auVar263._12_4_ = (uint)fVar271 & uVar50;
  auVar149._0_4_ = ~uVar47 & (uint)fVar143;
  auVar149._4_4_ = ~uVar48 & (uint)fVar52;
  auVar149._8_4_ = ~uVar49 & (uint)fVar80;
  auVar149._12_4_ = ~uVar50 & (uint)fVar82;
  auVar149 = auVar149 | auVar263;
  uVar47 = -(uint)(fVar143 <= ABS(fVar242));
  uVar48 = -(uint)(fVar52 <= ABS(fVar253));
  uVar49 = -(uint)(fVar80 <= ABS(fVar256));
  uVar50 = -(uint)(fVar82 <= ABS(fVar259));
  aVar248._0_4_ = (uint)fVar242 & uVar47;
  aVar248._4_4_ = (uint)fVar253 & uVar48;
  aVar248._8_4_ = (uint)fVar256 & uVar49;
  aVar248._12_4_ = (uint)fVar259 & uVar50;
  auVar167._0_4_ = ~uVar47 & (uint)fVar143;
  auVar167._4_4_ = ~uVar48 & (uint)fVar52;
  auVar167._8_4_ = ~uVar49 & (uint)fVar80;
  auVar167._12_4_ = ~uVar50 & (uint)fVar82;
  auVar167 = auVar167 | (undefined1  [16])aVar248;
  uVar47 = -(uint)(fVar143 <= ABS(fVar180));
  uVar48 = -(uint)(fVar52 <= ABS(fVar198));
  uVar49 = -(uint)(fVar80 <= ABS(fVar200));
  uVar50 = -(uint)(fVar82 <= ABS(fVar132));
  auVar194._0_4_ = (uint)fVar180 & uVar47;
  auVar194._4_4_ = (uint)fVar198 & uVar48;
  auVar194._8_4_ = (uint)fVar200 & uVar49;
  auVar194._12_4_ = (uint)fVar132 & uVar50;
  auVar221._0_4_ = ~uVar47 & (uint)fVar143;
  auVar221._4_4_ = ~uVar48 & (uint)fVar52;
  auVar221._8_4_ = ~uVar49 & (uint)fVar80;
  auVar221._12_4_ = ~uVar50 & (uint)fVar82;
  auVar221 = auVar221 | auVar194;
  auVar54 = rcpps(_DAT_01f4bd50,auVar149);
  fVar143 = auVar54._0_4_;
  fVar82 = auVar54._4_4_;
  fVar113 = auVar54._8_4_;
  fVar127 = auVar54._12_4_;
  fVar143 = (1.0 - auVar149._0_4_ * fVar143) * fVar143 + fVar143;
  fVar82 = (1.0 - auVar149._4_4_ * fVar82) * fVar82 + fVar82;
  fVar113 = (1.0 - auVar149._8_4_ * fVar113) * fVar113 + fVar113;
  fVar127 = (1.0 - auVar149._12_4_ * fVar127) * fVar127 + fVar127;
  auVar54 = rcpps(auVar54,auVar167);
  fVar52 = auVar54._0_4_;
  fVar86 = auVar54._4_4_;
  fVar116 = auVar54._8_4_;
  fVar132 = auVar54._12_4_;
  fVar52 = (1.0 - auVar167._0_4_ * fVar52) * fVar52 + fVar52;
  fVar86 = (1.0 - auVar167._4_4_ * fVar86) * fVar86 + fVar86;
  fVar116 = (1.0 - auVar167._8_4_ * fVar116) * fVar116 + fVar116;
  fVar132 = (1.0 - auVar167._12_4_ * fVar132) * fVar132 + fVar132;
  auVar54 = rcpps(auVar54,auVar221);
  fVar80 = auVar54._0_4_;
  fVar111 = auVar54._4_4_;
  fVar124 = auVar54._8_4_;
  fVar141 = auVar54._12_4_;
  fVar80 = (1.0 - auVar221._0_4_ * fVar80) * fVar80 + fVar80;
  fVar111 = (1.0 - auVar221._4_4_ * fVar111) * fVar111 + fVar111;
  fVar124 = (1.0 - auVar221._8_4_ * fVar124) * fVar124 + fVar124;
  fVar141 = (1.0 - auVar221._12_4_ * fVar141) * fVar141 + fVar141;
  uVar45 = *(ulong *)(prim + uVar43 * 7 + 6);
  uVar79 = (undefined2)(uVar45 >> 0x30);
  auVar54._8_4_ = 0;
  auVar54._0_8_ = uVar45;
  auVar54._12_2_ = uVar79;
  auVar54._14_2_ = uVar79;
  uVar79 = (undefined2)(uVar45 >> 0x20);
  auVar169._12_4_ = auVar54._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar45;
  auVar169._10_2_ = uVar79;
  auVar55._10_6_ = auVar169._10_6_;
  auVar55._8_2_ = uVar79;
  auVar55._0_8_ = uVar45;
  uVar79 = (undefined2)(uVar45 >> 0x10);
  auVar21._4_8_ = auVar55._8_8_;
  auVar21._2_2_ = uVar79;
  auVar21._0_2_ = uVar79;
  auVar150._0_8_ =
       CONCAT44(((float)(auVar21._0_4_ >> 0x10) - fVar175) * fVar82,
                ((float)(int)(short)uVar45 - fVar165) * fVar143);
  auVar150._8_4_ = ((float)(auVar55._8_4_ >> 0x10) - fVar177) * fVar113;
  auVar150._12_4_ = ((float)(auVar169._12_4_ >> 0x10) - fVar213) * fVar127;
  uVar45 = *(ulong *)(prim + uVar43 * 9 + 6);
  uVar79 = (undefined2)(uVar45 >> 0x30);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar45;
  auVar58._12_2_ = uVar79;
  auVar58._14_2_ = uVar79;
  uVar79 = (undefined2)(uVar45 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar45;
  auVar57._10_2_ = uVar79;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar79;
  auVar56._0_8_ = uVar45;
  uVar79 = (undefined2)(uVar45 >> 0x10);
  auVar22._4_8_ = auVar56._8_8_;
  auVar22._2_2_ = uVar79;
  auVar22._0_2_ = uVar79;
  auVar195._0_4_ = ((float)(int)(short)uVar45 - fVar165) * fVar143;
  auVar195._4_4_ = ((float)(auVar22._0_4_ >> 0x10) - fVar175) * fVar82;
  auVar195._8_4_ = ((float)(auVar56._8_4_ >> 0x10) - fVar177) * fVar113;
  auVar195._12_4_ = ((float)(auVar57._12_4_ >> 0x10) - fVar213) * fVar127;
  uVar45 = *(ulong *)(prim + uVar43 * 0xe + 6);
  uVar79 = (undefined2)(uVar45 >> 0x30);
  auVar61._8_4_ = 0;
  auVar61._0_8_ = uVar45;
  auVar61._12_2_ = uVar79;
  auVar61._14_2_ = uVar79;
  uVar79 = (undefined2)(uVar45 >> 0x20);
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._8_2_ = 0;
  auVar60._0_8_ = uVar45;
  auVar60._10_2_ = uVar79;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._8_2_ = uVar79;
  auVar59._0_8_ = uVar45;
  uVar79 = (undefined2)(uVar45 >> 0x10);
  auVar23._4_8_ = auVar59._8_8_;
  auVar23._2_2_ = uVar79;
  auVar23._0_2_ = uVar79;
  auVar119._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar219) * fVar86,
                ((float)(int)(short)uVar45 - fVar218) * fVar52);
  auVar119._8_4_ = ((float)(auVar59._8_4_ >> 0x10) - fVar226) * fVar116;
  auVar119._12_4_ = ((float)(auVar60._12_4_ >> 0x10) - fVar228) * fVar132;
  uVar45 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  uVar79 = (undefined2)(uVar45 >> 0x30);
  auVar64._8_4_ = 0;
  auVar64._0_8_ = uVar45;
  auVar64._12_2_ = uVar79;
  auVar64._14_2_ = uVar79;
  uVar79 = (undefined2)(uVar45 >> 0x20);
  auVar63._12_4_ = auVar64._12_4_;
  auVar63._8_2_ = 0;
  auVar63._0_8_ = uVar45;
  auVar63._10_2_ = uVar79;
  auVar62._10_6_ = auVar63._10_6_;
  auVar62._8_2_ = uVar79;
  auVar62._0_8_ = uVar45;
  uVar79 = (undefined2)(uVar45 >> 0x10);
  auVar24._4_8_ = auVar62._8_8_;
  auVar24._2_2_ = uVar79;
  auVar24._0_2_ = uVar79;
  aVar217._0_4_ = ((float)(int)(short)uVar45 - fVar218) * fVar52;
  aVar217._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar219) * fVar86;
  aVar217._8_4_ = ((float)(auVar62._8_4_ >> 0x10) - fVar226) * fVar116;
  aVar217._12_4_ = ((float)(auVar63._12_4_ >> 0x10) - fVar228) * fVar132;
  uVar45 = *(ulong *)(prim + uVar43 * 0x15 + 6);
  uVar79 = (undefined2)(uVar45 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar45;
  auVar67._12_2_ = uVar79;
  auVar67._14_2_ = uVar79;
  uVar79 = (undefined2)(uVar45 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar45;
  auVar66._10_2_ = uVar79;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar79;
  auVar65._0_8_ = uVar45;
  uVar79 = (undefined2)(uVar45 >> 0x10);
  auVar25._4_8_ = auVar65._8_8_;
  auVar25._2_2_ = uVar79;
  auVar25._0_2_ = uVar79;
  auVar100._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar208) * fVar111,
                ((float)(int)(short)uVar45 - fVar203) * fVar80);
  auVar100._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar210) * fVar124;
  auVar100._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar147) * fVar141;
  uVar45 = *(ulong *)(prim + uVar43 * 0x17 + 6);
  uVar79 = (undefined2)(uVar45 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar45;
  auVar70._12_2_ = uVar79;
  auVar70._14_2_ = uVar79;
  uVar79 = (undefined2)(uVar45 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar45;
  auVar69._10_2_ = uVar79;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar79;
  auVar68._0_8_ = uVar45;
  uVar79 = (undefined2)(uVar45 >> 0x10);
  auVar26._4_8_ = auVar68._8_8_;
  auVar26._2_2_ = uVar79;
  auVar26._0_2_ = uVar79;
  auVar71._0_4_ = ((float)(int)(short)uVar45 - fVar203) * fVar80;
  auVar71._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar208) * fVar111;
  auVar71._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar210) * fVar124;
  auVar71._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar147) * fVar141;
  auVar168._8_4_ = auVar150._8_4_;
  auVar168._0_8_ = auVar150._0_8_;
  auVar168._12_4_ = auVar150._12_4_;
  auVar169 = minps(auVar168,auVar195);
  auVar134._8_4_ = auVar119._8_4_;
  auVar134._0_8_ = auVar119._0_8_;
  auVar134._12_4_ = auVar119._12_4_;
  auVar54 = minps(auVar134,(undefined1  [16])aVar217);
  auVar169 = maxps(auVar169,auVar54);
  auVar135._8_4_ = auVar100._8_4_;
  auVar135._0_8_ = auVar100._0_8_;
  auVar135._12_4_ = auVar100._12_4_;
  auVar54 = minps(auVar135,auVar71);
  aVar207.i[1] = uVar46;
  aVar207.i[0] = uVar46;
  aVar207.i[2] = uVar46;
  aVar207.i[3] = uVar46;
  auVar54 = maxps(auVar54,(undefined1  [16])aVar207);
  auVar54 = maxps(auVar169,auVar54);
  local_48 = auVar54._0_4_ * 0.99999964;
  fStack_44 = auVar54._4_4_ * 0.99999964;
  fStack_40 = auVar54._8_4_ * 0.99999964;
  fStack_3c = auVar54._12_4_ * 0.99999964;
  auVar169 = maxps(auVar150,auVar195);
  auVar54 = maxps(auVar119,(undefined1  [16])aVar217);
  auVar169 = minps(auVar169,auVar54);
  auVar54 = maxps(auVar100,auVar71);
  uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar72._4_4_ = uVar46;
  auVar72._0_4_ = uVar46;
  auVar72._8_4_ = uVar46;
  auVar72._12_4_ = uVar46;
  auVar54 = minps(auVar54,auVar72);
  auVar54 = minps(auVar169,auVar54);
  auVar101._0_4_ = -(uint)(PVar4 != (Primitive)0x0 && local_48 <= auVar54._0_4_ * 1.0000004);
  auVar101._4_4_ = -(uint)(1 < (byte)PVar4 && fStack_44 <= auVar54._4_4_ * 1.0000004);
  auVar101._8_4_ = -(uint)(2 < (byte)PVar4 && fStack_40 <= auVar54._8_4_ * 1.0000004);
  auVar101._12_4_ = -(uint)(3 < (byte)PVar4 && fStack_3c <= auVar54._12_4_ * 1.0000004);
  uVar46 = movmskps((int)unaff_R14,auVar101);
  local_398 = mm_lookupmask_ps._0_8_;
  uStack_390 = mm_lookupmask_ps._8_8_;
  local_338 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  uVar45 = CONCAT44((int)((ulong)unaff_R14 >> 0x20),uVar46);
  local_330 = pre;
  while (uVar45 != 0) {
    lVar40 = 0;
    if (uVar45 != 0) {
      for (; (uVar45 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
      }
    }
    uVar44 = uVar45 - 1 & uVar45;
    uVar47 = *(uint *)(prim + 2);
    local_3a0 = (ulong)uVar47;
    uStack_2f0._0_4_ = *(uint *)(prim + lVar40 * 4 + 6);
    pauVar34 = (undefined1 (*) [16])(ulong)(uint)uStack_2f0;
    pGVar7 = (context->scene->geometries).items[local_3a0].ptr;
    pGVar39 = (Geometry *)
              pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    uVar43 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 + (long)pGVar39 * (long)pauVar34);
    p_Var32 = pGVar7[1].intersectionFilterN;
    lVar40 = *(long *)&pGVar7[1].time_range.upper;
    pfVar1 = (float *)(lVar40 + (long)p_Var32 * uVar43);
    local_388 = *pfVar1;
    fStack_384 = pfVar1[1];
    bhit.curve3D.v0.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_380 = pfVar1[2];
    fVar143 = pfVar1[3];
    bhit.curve3D.v0.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    pfVar1 = (float *)(lVar40 + (uVar43 + 1) * (long)p_Var32);
    local_348 = *pfVar1;
    fStack_344 = pfVar1[1];
    bhit.curve3D.v1.field_0._0_8_ = *(undefined8 *)pfVar1;
    fStack_340 = pfVar1[2];
    fVar52 = pfVar1[3];
    bhit.curve3D.v1.field_0._8_8_ = *(undefined8 *)(pfVar1 + 2);
    pfVar1 = (float *)(lVar40 + (uVar43 + 2) * (long)p_Var32);
    fVar80 = *pfVar1;
    fVar82 = pfVar1[1];
    fVar86 = pfVar1[2];
    fVar111 = pfVar1[3];
    lVar41 = 0;
    if (uVar44 != 0) {
      for (; (uVar44 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
      }
    }
    pfVar1 = (float *)(lVar40 + (uVar43 + 3) * (long)p_Var32);
    fVar113 = *pfVar1;
    fVar116 = pfVar1[1];
    uVar8 = *(undefined8 *)pfVar1;
    bhit.curve3D.v3.field_0._0_8_ = *(undefined8 *)pfVar1;
    pfVar9 = pfVar1 + 2;
    fVar124 = *pfVar9;
    local_58 = pfVar1[3];
    uVar31 = *(undefined8 *)pfVar9;
    bhit.curve3D.v3.field_0._8_8_ = *(undefined8 *)pfVar9;
    if ((uVar44 != 0) && (uVar43 = uVar44 - 1 & uVar44, uVar43 != 0)) {
      lVar40 = 0;
      if (uVar43 != 0) {
        for (; (uVar43 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
        }
      }
      pGVar39 = (Geometry *)((long)pGVar39 * (ulong)*(uint *)(prim + lVar40 * 4 + 6));
    }
    iVar6 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar127 = *(float *)(ray + k * 4);
    fVar132 = *(float *)(ray + k * 4 + 0x10);
    fVar141 = *(float *)(ray + k * 4 + 0x20);
    fVar162 = local_388 - fVar127;
    fVar180 = fStack_384 - fVar132;
    fVar198 = fStack_380 - fVar141;
    fVar165 = pre->ray_space[k].vx.field_0.m128[0];
    fVar175 = pre->ray_space[k].vx.field_0.m128[1];
    fVar177 = pre->ray_space[k].vx.field_0.m128[2];
    fVar213 = pre->ray_space[k].vy.field_0.m128[0];
    fVar203 = pre->ray_space[k].vy.field_0.m128[1];
    fVar208 = pre->ray_space[k].vy.field_0.m128[2];
    fVar210 = pre->ray_space[k].vz.field_0.m128[0];
    fVar147 = pre->ray_space[k].vz.field_0.m128[1];
    fVar160 = pre->ray_space[k].vz.field_0.m128[2];
    fVar220 = fVar162 * fVar165 + fVar180 * fVar213 + fVar198 * fVar210;
    fVar223 = fVar162 * fVar175 + fVar180 * fVar203 + fVar198 * fVar147;
    fVar224 = fVar162 * fVar177 + fVar180 * fVar208 + fVar198 * fVar160;
    fVar162 = local_348 - fVar127;
    fVar180 = fStack_344 - fVar132;
    fVar198 = fStack_340 - fVar141;
    local_358 = fVar162 * fVar165 + fVar180 * fVar213 + fVar198 * fVar210;
    local_368 = fVar162 * fVar175 + fVar180 * fVar203 + fVar198 * fVar147;
    fVar200 = fVar162 * fVar177 + fVar180 * fVar208 + fVar198 * fVar160;
    fVar162 = fVar80 - fVar127;
    fVar180 = fVar82 - fVar132;
    fVar198 = fVar86 - fVar141;
    fVar218 = fVar162 * fVar165 + fVar180 * fVar213 + fVar198 * fVar210;
    fVar219 = fVar162 * fVar175 + fVar180 * fVar203 + fVar198 * fVar147;
    fVar162 = fVar162 * fVar177 + fVar180 * fVar208 + fVar198 * fVar160;
    fVar127 = fVar113 - fVar127;
    fVar132 = fVar116 - fVar132;
    fVar141 = fVar124 - fVar141;
    fVar165 = fVar127 * fVar165 + fVar132 * fVar213 + fVar141 * fVar210;
    fVar175 = fVar127 * fVar175 + fVar132 * fVar203 + fVar141 * fVar147;
    fVar132 = fVar127 * fVar177 + fVar132 * fVar208 + fVar141 * fVar160;
    auVar280._0_8_ = CONCAT44(fVar223,fVar220) & 0x7fffffff7fffffff;
    auVar280._8_4_ = ABS(fVar224);
    auVar280._12_4_ = ABS(fVar143);
    auVar151._0_8_ = CONCAT44(local_368,local_358) & 0x7fffffff7fffffff;
    auVar151._8_4_ = ABS(fVar200);
    auVar151._12_4_ = ABS(fVar52);
    auVar169 = maxps(auVar280,auVar151);
    auVar170._0_8_ = CONCAT44(fVar219,fVar218) & 0x7fffffff7fffffff;
    auVar170._8_4_ = ABS(fVar162);
    auVar170._12_4_ = ABS(fVar111);
    auVar102._0_8_ = CONCAT44(fVar175,fVar165) & 0x7fffffff7fffffff;
    auVar102._8_4_ = ABS(fVar132);
    auVar102._12_4_ = ABS(local_58);
    auVar54 = maxps(auVar170,auVar102);
    auVar54 = maxps(auVar169,auVar54);
    fVar127 = auVar54._4_4_;
    if (auVar54._4_4_ <= auVar54._0_4_) {
      fVar127 = auVar54._0_4_;
    }
    fVar141 = (float)iVar6;
    auVar281._8_8_ = auVar54._8_8_;
    auVar281._0_8_ = auVar54._8_8_;
    if (auVar54._8_4_ <= fVar127) {
      auVar281._0_4_ = fVar127;
    }
    lVar40 = (long)iVar6 * 0x44;
    fVar127 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar40 + 0x908);
    fVar177 = *(float *)(bspline_basis0 + lVar40 + 0x90c);
    fVar213 = *(float *)(bspline_basis0 + lVar40 + 0x910);
    auVar13 = *(undefined1 (*) [12])(bspline_basis0 + lVar40 + 0x908);
    fVar203 = *(float *)(bspline_basis0 + lVar40 + 0x914);
    fVar208 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar40 + 0xd8c);
    fVar210 = *(float *)(bspline_basis0 + lVar40 + 0xd90);
    fVar147 = *(float *)(bspline_basis0 + lVar40 + 0xd94);
    auVar12 = *(undefined1 (*) [12])(bspline_basis0 + lVar40 + 0xd8c);
    fVar160 = *(float *)(bspline_basis0 + lVar40 + 0xd98);
    fVar180 = *(float *)(bspline_basis0 + lVar40 + 0x484);
    fVar198 = *(float *)(bspline_basis0 + lVar40 + 0x488);
    fVar226 = *(float *)(bspline_basis0 + lVar40 + 0x48c);
    fVar228 = *(float *)(bspline_basis0 + lVar40 + 0x490);
    fVar230 = *(float *)*(undefined1 (*) [12])(bspline_basis0 + lVar40);
    fVar242 = *(float *)(bspline_basis0 + lVar40 + 4);
    fVar253 = *(float *)(bspline_basis0 + lVar40 + 8);
    auVar14 = *(undefined1 (*) [12])(bspline_basis0 + lVar40);
    fVar256 = *(float *)(bspline_basis0 + lVar40 + 0xc);
    fVar243 = fVar220 * fVar230 + local_358 * fVar180 + fVar218 * fVar127 + fVar165 * fVar208;
    fVar254 = fVar220 * fVar242 + local_358 * fVar198 + fVar218 * fVar177 + fVar165 * fVar210;
    fVar257 = fVar220 * fVar253 + local_358 * fVar226 + fVar218 * fVar213 + fVar165 * fVar147;
    fVar260 = fVar220 * fVar256 + local_358 * fVar228 + fVar218 * fVar203 + fVar165 * fVar160;
    fVar133 = fVar223 * fVar230 + local_368 * fVar180 + fVar219 * fVar127 + fVar175 * fVar208;
    fVar142 = fVar223 * fVar242 + local_368 * fVar198 + fVar219 * fVar177 + fVar175 * fVar210;
    fVar144 = fVar223 * fVar253 + local_368 * fVar226 + fVar219 * fVar213 + fVar175 * fVar147;
    fVar145 = fVar223 * fVar256 + local_368 * fVar228 + fVar219 * fVar203 + fVar175 * fVar160;
    fVar166 = fVar143 * fVar230 + fVar52 * fVar180 + fVar111 * fVar127 + local_58 * fVar208;
    fVar176 = fVar143 * fVar242 + fVar52 * fVar198 + fVar111 * fVar177 + local_58 * fVar210;
    auVar214._4_4_ = fVar176;
    auVar214._0_4_ = fVar166;
    fVar178 = fVar143 * fVar253 + fVar52 * fVar226 + fVar111 * fVar213 + local_58 * fVar147;
    fVar179 = fVar143 * fVar256 + fVar52 * fVar228 + fVar111 * fVar203 + local_58 * fVar160;
    fVar177 = *(float *)(bspline_basis1 + lVar40 + 0xd8c);
    fVar213 = *(float *)(bspline_basis1 + lVar40 + 0xd90);
    fVar208 = *(float *)(bspline_basis1 + lVar40 + 0xd94);
    fVar210 = *(float *)(bspline_basis1 + lVar40 + 0xd98);
    fVar127 = *(float *)*(undefined1 (*) [12])(bspline_basis1 + lVar40 + 0x908);
    fVar147 = *(float *)(bspline_basis1 + lVar40 + 0x90c);
    fVar230 = *(float *)(bspline_basis1 + lVar40 + 0x910);
    auVar15 = *(undefined1 (*) [12])(bspline_basis1 + lVar40 + 0x908);
    fVar242 = *(float *)(bspline_basis1 + lVar40 + 0x914);
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    fVar253 = *(float *)(bspline_basis1 + lVar40 + 0x484);
    fVar259 = *(float *)(bspline_basis1 + lVar40 + 0x488);
    fVar262 = *(float *)(bspline_basis1 + lVar40 + 0x48c);
    fVar269 = *(float *)(bspline_basis1 + lVar40 + 0x490);
    fVar270 = *(float *)(bspline_basis1 + lVar40);
    fVar271 = *(float *)(bspline_basis1 + lVar40 + 4);
    fVar279 = *(float *)(bspline_basis1 + lVar40 + 8);
    fVar283 = *(float *)(bspline_basis1 + lVar40 + 0xc);
    fVar204 = fVar220 * fVar270 + local_358 * fVar253 + fVar218 * fVar127 + fVar165 * fVar177;
    fVar209 = fVar220 * fVar271 + local_358 * fVar259 + fVar218 * fVar147 + fVar165 * fVar213;
    fVar211 = fVar220 * fVar279 + local_358 * fVar262 + fVar218 * fVar230 + fVar165 * fVar208;
    fVar212 = fVar220 * fVar283 + local_358 * fVar269 + fVar218 * fVar242 + fVar165 * fVar210;
    fVar53 = fVar223 * fVar270 + local_368 * fVar253 + fVar219 * fVar127 + fVar175 * fVar177;
    fVar81 = fVar223 * fVar271 + local_368 * fVar259 + fVar219 * fVar147 + fVar175 * fVar213;
    fVar83 = fVar223 * fVar279 + local_368 * fVar262 + fVar219 * fVar230 + fVar175 * fVar208;
    fVar84 = fVar223 * fVar283 + local_368 * fVar269 + fVar219 * fVar242 + fVar175 * fVar210;
    auVar120._0_4_ = fVar143 * fVar270 + fVar52 * fVar253 + fVar111 * fVar127 + local_58 * fVar177;
    auVar120._4_4_ = fVar143 * fVar271 + fVar52 * fVar259 + fVar111 * fVar147 + local_58 * fVar213;
    auVar120._8_4_ = fVar143 * fVar279 + fVar52 * fVar262 + fVar111 * fVar230 + local_58 * fVar208;
    auVar120._12_4_ = fVar143 * fVar283 + fVar52 * fVar269 + fVar111 * fVar242 + local_58 * fVar210;
    fVar181 = fVar204 - fVar243;
    fVar199 = fVar209 - fVar254;
    fVar201 = fVar211 - fVar257;
    fVar202 = fVar212 - fVar260;
    fVar148 = fVar53 - fVar133;
    fVar161 = fVar81 - fVar142;
    fVar163 = fVar83 - fVar144;
    fVar164 = fVar84 - fVar145;
    fVar127 = fVar133 * fVar181 - fVar243 * fVar148;
    fVar147 = fVar142 * fVar199 - fVar254 * fVar161;
    fVar230 = fVar144 * fVar201 - fVar257 * fVar163;
    fVar146 = fVar145 * fVar202 - fVar260 * fVar164;
    auVar214._8_4_ = fVar178;
    auVar214._12_4_ = fVar179;
    auVar54 = maxps(auVar214,auVar120);
    bVar29 = fVar127 * fVar127 <=
             auVar54._0_4_ * auVar54._0_4_ * (fVar181 * fVar181 + fVar148 * fVar148) &&
             0.0 < fVar141;
    auVar136._0_4_ = -(uint)bVar29;
    bVar30 = fVar147 * fVar147 <=
             auVar54._4_4_ * auVar54._4_4_ * (fVar199 * fVar199 + fVar161 * fVar161) &&
             1.0 < fVar141;
    auVar136._4_4_ = -(uint)bVar30;
    bVar28 = fVar230 * fVar230 <=
             auVar54._8_4_ * auVar54._8_4_ * (fVar201 * fVar201 + fVar163 * fVar163) &&
             2.0 < fVar141;
    auVar136._8_4_ = -(uint)bVar28;
    bVar27 = 3.0 < fVar141 &&
             fVar146 * fVar146 <=
             auVar54._12_4_ * auVar54._12_4_ * (fVar202 * fVar202 + fVar164 * fVar164);
    auVar136._12_4_ = -(uint)bVar27;
    register0x000015c4 = auVar281._4_12_;
    local_378._0_4_ = auVar281._0_4_ * 4.7683716e-07;
    iVar36 = movmskps((int)(pre->ray_space + k),auVar136);
    fVar127 = *(float *)(ray + k * 4 + 0x30);
    fStack_37c = fVar143;
    fStack_364 = local_368;
    fStack_360 = local_368;
    fStack_35c = local_368;
    fStack_354 = local_358;
    fStack_350 = local_358;
    fStack_34c = local_358;
    fStack_33c = fVar52;
    if (iVar36 == 0) {
      uVar43 = 0;
    }
    else {
      local_478 = auVar15._0_4_;
      fStack_474 = auVar15._4_4_;
      fStack_470 = auVar15._8_4_;
      fVar117 = fVar177 * fVar132 + local_478 * fVar162 + fVar253 * fVar200 + fVar270 * fVar224;
      fVar125 = fVar213 * fVar132 + fStack_474 * fVar162 + fVar259 * fVar200 + fVar271 * fVar224;
      fVar128 = fVar208 * fVar132 + fStack_470 * fVar162 + fVar262 * fVar200 + fVar279 * fVar224;
      fVar130 = fVar210 * fVar132 + fVar242 * fVar162 + fVar269 * fVar200 + fVar283 * fVar224;
      local_418 = auVar14._0_4_;
      fStack_414 = auVar14._4_4_;
      fStack_410 = auVar14._8_4_;
      local_468._0_4_ = auVar13._0_4_;
      local_468._4_4_ = auVar13._4_4_;
      uStack_460._0_4_ = auVar13._8_4_;
      local_4f8 = auVar12._0_4_;
      fStack_4f4 = auVar12._4_4_;
      fStack_4f0 = auVar12._8_4_;
      fVar118 = local_4f8 * fVar132 + (float)local_468 * fVar162 + fVar180 * fVar200 +
                local_418 * fVar224;
      fVar126 = fStack_4f4 * fVar132 + local_468._4_4_ * fVar162 + fVar198 * fVar200 +
                fStack_414 * fVar224;
      fVar129 = fStack_4f0 * fVar132 + (float)uStack_460 * fVar162 + fVar226 * fVar200 +
                fStack_410 * fVar224;
      fVar131 = fVar160 * fVar132 + fVar203 * fVar162 + fVar228 * fVar200 + fVar256 * fVar224;
      fVar177 = *(float *)(bspline_basis0 + lVar40 + 0x1210);
      fVar213 = *(float *)(bspline_basis0 + lVar40 + 0x1214);
      fVar203 = *(float *)(bspline_basis0 + lVar40 + 0x1218);
      fVar208 = *(float *)(bspline_basis0 + lVar40 + 0x121c);
      fVar210 = *(float *)(bspline_basis0 + lVar40 + 0x1694);
      fVar147 = *(float *)(bspline_basis0 + lVar40 + 0x1698);
      fVar160 = *(float *)(bspline_basis0 + lVar40 + 0x169c);
      fVar180 = *(float *)(bspline_basis0 + lVar40 + 0x16a0);
      fVar198 = *(float *)(bspline_basis0 + lVar40 + 0x1b18);
      fVar226 = *(float *)(bspline_basis0 + lVar40 + 0x1b1c);
      fVar228 = *(float *)(bspline_basis0 + lVar40 + 0x1b20);
      fVar230 = *(float *)(bspline_basis0 + lVar40 + 0x1b24);
      fVar242 = *(float *)(bspline_basis0 + lVar40 + 0x1f9c);
      fVar253 = *(float *)(bspline_basis0 + lVar40 + 0x1fa0);
      fVar256 = *(float *)(bspline_basis0 + lVar40 + 0x1fa4);
      fVar259 = *(float *)(bspline_basis0 + lVar40 + 0x1fa8);
      fVar234 = fVar220 * fVar177 + local_358 * fVar210 + fVar218 * fVar198 + fVar165 * fVar242;
      fVar237 = fVar220 * fVar213 + local_358 * fVar147 + fVar218 * fVar226 + fVar165 * fVar253;
      fVar239 = fVar220 * fVar203 + local_358 * fVar160 + fVar218 * fVar228 + fVar165 * fVar256;
      fVar241 = fVar220 * fVar208 + local_358 * fVar180 + fVar218 * fVar230 + fVar165 * fVar259;
      fVar278 = fVar223 * fVar177 + local_368 * fVar210 + fVar219 * fVar198 + fVar175 * fVar242;
      fVar282 = fVar223 * fVar213 + local_368 * fVar147 + fVar219 * fVar226 + fVar175 * fVar253;
      fVar284 = fVar223 * fVar203 + local_368 * fVar160 + fVar219 * fVar228 + fVar175 * fVar256;
      fVar285 = fVar223 * fVar208 + local_368 * fVar180 + fVar219 * fVar230 + fVar175 * fVar259;
      fVar262 = *(float *)(bspline_basis1 + lVar40 + 0x1210);
      fVar269 = *(float *)(bspline_basis1 + lVar40 + 0x1214);
      fVar270 = *(float *)(bspline_basis1 + lVar40 + 0x1218);
      fVar271 = *(float *)(bspline_basis1 + lVar40 + 0x121c);
      fVar279 = *(float *)(bspline_basis1 + lVar40 + 0x1b18);
      fVar283 = *(float *)(bspline_basis1 + lVar40 + 0x1b1c);
      fVar146 = *(float *)(bspline_basis1 + lVar40 + 0x1b20);
      fVar225 = *(float *)(bspline_basis1 + lVar40 + 0x1b24);
      fVar227 = *(float *)(bspline_basis1 + lVar40 + 0x1f9c);
      fVar229 = *(float *)(bspline_basis1 + lVar40 + 0x1fa0);
      fVar231 = *(float *)(bspline_basis1 + lVar40 + 0x1fa4);
      fVar232 = *(float *)(bspline_basis1 + lVar40 + 0x1fa8);
      auVar152._0_4_ = fVar175 * fVar227;
      auVar152._4_4_ = fVar175 * fVar229;
      auVar152._8_4_ = fVar175 * fVar231;
      auVar152._12_4_ = fVar175 * fVar232;
      fVar244 = *(float *)(bspline_basis1 + lVar40 + 0x1694);
      fVar255 = *(float *)(bspline_basis1 + lVar40 + 0x1698);
      fVar258 = *(float *)(bspline_basis1 + lVar40 + 0x169c);
      fVar261 = *(float *)(bspline_basis1 + lVar40 + 0x16a0);
      fVar272 = fVar220 * fVar262 + local_358 * fVar244 + fVar218 * fVar279 + fVar165 * fVar227;
      fVar275 = fVar220 * fVar269 + local_358 * fVar255 + fVar218 * fVar283 + fVar165 * fVar229;
      fVar276 = fVar220 * fVar270 + local_358 * fVar258 + fVar218 * fVar146 + fVar165 * fVar231;
      fVar277 = fVar220 * fVar271 + local_358 * fVar261 + fVar218 * fVar225 + fVar165 * fVar232;
      fVar87 = fVar223 * fVar262 + local_368 * fVar244 + fVar219 * fVar279 + auVar152._0_4_;
      fVar112 = fVar223 * fVar269 + local_368 * fVar255 + fVar219 * fVar283 + auVar152._4_4_;
      fVar114 = fVar223 * fVar270 + local_368 * fVar258 + fVar219 * fVar146 + auVar152._8_4_;
      fVar115 = fVar223 * fVar271 + local_368 * fVar261 + fVar219 * fVar225 + auVar152._12_4_;
      auVar249._0_8_ = CONCAT44(fVar237,fVar234) & 0x7fffffff7fffffff;
      auVar249._8_4_ = ABS(fVar239);
      auVar249._12_4_ = ABS(fVar241);
      auVar215._0_8_ = CONCAT44(fVar282,fVar278) & 0x7fffffff7fffffff;
      auVar215._8_4_ = ABS(fVar284);
      auVar215._12_4_ = ABS(fVar285);
      auVar54 = maxps(auVar249,auVar215);
      auVar264._0_8_ =
           CONCAT44(fVar213 * fVar224 + fVar147 * fVar200 + fVar226 * fVar162 + fVar253 * fVar132,
                    fVar177 * fVar224 + fVar210 * fVar200 + fVar198 * fVar162 + fVar242 * fVar132) &
           0x7fffffff7fffffff;
      auVar264._8_4_ =
           ABS(fVar203 * fVar224 + fVar160 * fVar200 + fVar228 * fVar162 + fVar256 * fVar132);
      auVar264._12_4_ =
           ABS(fVar208 * fVar224 + fVar180 * fVar200 + fVar230 * fVar162 + fVar259 * fVar132);
      auVar54 = maxps(auVar54,auVar264);
      uVar48 = -(uint)((float)local_378._0_4_ <= auVar54._0_4_);
      uVar49 = -(uint)((float)local_378._0_4_ <= auVar54._4_4_);
      uVar50 = -(uint)((float)local_378._0_4_ <= auVar54._8_4_);
      uVar51 = -(uint)((float)local_378._0_4_ <= auVar54._12_4_);
      fVar210 = (float)((uint)fVar234 & uVar48 | ~uVar48 & (uint)fVar181);
      fVar147 = (float)((uint)fVar237 & uVar49 | ~uVar49 & (uint)fVar199);
      fVar160 = (float)((uint)fVar239 & uVar50 | ~uVar50 & (uint)fVar201);
      fVar180 = (float)((uint)fVar241 & uVar51 | ~uVar51 & (uint)fVar202);
      fVar198 = (float)(~uVar48 & (uint)fVar148 | (uint)fVar278 & uVar48);
      fVar226 = (float)(~uVar49 & (uint)fVar161 | (uint)fVar282 & uVar49);
      fVar228 = (float)(~uVar50 & (uint)fVar163 | (uint)fVar284 & uVar50);
      fVar230 = (float)(~uVar51 & (uint)fVar164 | (uint)fVar285 & uVar51);
      auVar265._0_8_ = CONCAT44(fVar275,fVar272) & 0x7fffffff7fffffff;
      auVar265._8_4_ = ABS(fVar276);
      auVar265._12_4_ = ABS(fVar277);
      auVar222._0_8_ = CONCAT44(fVar112,fVar87) & 0x7fffffff7fffffff;
      auVar222._8_4_ = ABS(fVar114);
      auVar222._12_4_ = ABS(fVar115);
      auVar54 = maxps(auVar265,auVar222);
      auVar196._0_8_ =
           CONCAT44(fVar269 * fVar224 + fVar255 * fVar200 + fVar283 * fVar162 + fVar229 * fVar132,
                    fVar262 * fVar224 + fVar244 * fVar200 + fVar279 * fVar162 + fVar227 * fVar132) &
           0x7fffffff7fffffff;
      auVar196._8_4_ =
           ABS(fVar270 * fVar224 + fVar258 * fVar200 + fVar146 * fVar162 + fVar231 * fVar132);
      auVar196._12_4_ =
           ABS(fVar271 * fVar224 + fVar261 * fVar200 + fVar225 * fVar162 + fVar232 * fVar132);
      auVar54 = maxps(auVar54,auVar196);
      uVar48 = -(uint)((float)local_378._0_4_ <= auVar54._0_4_);
      uVar49 = -(uint)((float)local_378._0_4_ <= auVar54._4_4_);
      uVar50 = -(uint)((float)local_378._0_4_ <= auVar54._8_4_);
      uVar51 = -(uint)((float)local_378._0_4_ <= auVar54._12_4_);
      fVar262 = (float)((uint)fVar272 & uVar48 | ~uVar48 & (uint)fVar181);
      fVar269 = (float)((uint)fVar275 & uVar49 | ~uVar49 & (uint)fVar199);
      fVar270 = (float)((uint)fVar276 & uVar50 | ~uVar50 & (uint)fVar201);
      fVar271 = (float)((uint)fVar277 & uVar51 | ~uVar51 & (uint)fVar202);
      fVar242 = (float)(~uVar48 & (uint)fVar148 | (uint)fVar87 & uVar48);
      fVar253 = (float)(~uVar49 & (uint)fVar161 | (uint)fVar112 & uVar49);
      fVar256 = (float)(~uVar50 & (uint)fVar163 | (uint)fVar114 & uVar50);
      fVar259 = (float)(~uVar51 & (uint)fVar164 | (uint)fVar115 & uVar51);
      auVar103._0_4_ = fVar198 * fVar198 + fVar210 * fVar210;
      auVar103._4_4_ = fVar226 * fVar226 + fVar147 * fVar147;
      auVar103._8_4_ = fVar228 * fVar228 + fVar160 * fVar160;
      auVar103._12_4_ = fVar230 * fVar230 + fVar180 * fVar180;
      auVar54 = rsqrtps(auVar152,auVar103);
      fVar177 = auVar54._0_4_;
      fVar213 = auVar54._4_4_;
      fVar203 = auVar54._8_4_;
      fVar208 = auVar54._12_4_;
      auVar153._0_4_ = fVar177 * fVar177 * auVar103._0_4_ * 0.5 * fVar177;
      auVar153._4_4_ = fVar213 * fVar213 * auVar103._4_4_ * 0.5 * fVar213;
      auVar153._8_4_ = fVar203 * fVar203 * auVar103._8_4_ * 0.5 * fVar203;
      auVar153._12_4_ = fVar208 * fVar208 * auVar103._12_4_ * 0.5 * fVar208;
      fVar279 = fVar177 * 1.5 - auVar153._0_4_;
      fVar283 = fVar213 * 1.5 - auVar153._4_4_;
      fVar146 = fVar203 * 1.5 - auVar153._8_4_;
      fVar148 = fVar208 * 1.5 - auVar153._12_4_;
      auVar104._0_4_ = fVar242 * fVar242 + fVar262 * fVar262;
      auVar104._4_4_ = fVar253 * fVar253 + fVar269 * fVar269;
      auVar104._8_4_ = fVar256 * fVar256 + fVar270 * fVar270;
      auVar104._12_4_ = fVar259 * fVar259 + fVar271 * fVar271;
      auVar54 = rsqrtps(auVar153,auVar104);
      fVar177 = auVar54._0_4_;
      fVar213 = auVar54._4_4_;
      fVar203 = auVar54._8_4_;
      fVar208 = auVar54._12_4_;
      fVar177 = fVar177 * 1.5 - fVar177 * fVar177 * auVar104._0_4_ * 0.5 * fVar177;
      fVar213 = fVar213 * 1.5 - fVar213 * fVar213 * auVar104._4_4_ * 0.5 * fVar213;
      fVar203 = fVar203 * 1.5 - fVar203 * fVar203 * auVar104._8_4_ * 0.5 * fVar203;
      fVar208 = fVar208 * 1.5 - fVar208 * fVar208 * auVar104._12_4_ * 0.5 * fVar208;
      fVar244 = fVar198 * fVar279 * fVar166;
      fVar255 = fVar226 * fVar283 * fVar176;
      fVar258 = fVar228 * fVar146 * fVar178;
      fVar261 = fVar230 * fVar148 * fVar179;
      fVar198 = -fVar210 * fVar279 * fVar166;
      fVar226 = -fVar147 * fVar283 * fVar176;
      fVar228 = -fVar160 * fVar146 * fVar178;
      fVar230 = -fVar180 * fVar148 * fVar179;
      fVar234 = fVar279 * 0.0 * fVar166;
      fVar237 = fVar283 * 0.0 * fVar176;
      fVar239 = fVar146 * 0.0 * fVar178;
      fVar241 = fVar148 * 0.0 * fVar179;
      fVar87 = fVar242 * fVar177 * auVar120._0_4_;
      fVar112 = fVar253 * fVar213 * auVar120._4_4_;
      fVar114 = fVar256 * fVar203 * auVar120._8_4_;
      fVar115 = fVar259 * fVar208 * auVar120._12_4_;
      fVar227 = fVar204 + fVar87;
      fVar229 = fVar209 + fVar112;
      fVar231 = fVar211 + fVar114;
      fVar232 = fVar212 + fVar115;
      fVar199 = -fVar262 * fVar177 * auVar120._0_4_;
      fVar201 = -fVar269 * fVar213 * auVar120._4_4_;
      fVar202 = -fVar270 * fVar203 * auVar120._8_4_;
      fVar225 = -fVar271 * fVar208 * auVar120._12_4_;
      fVar279 = fVar53 + fVar199;
      fVar283 = fVar81 + fVar201;
      fVar146 = fVar83 + fVar202;
      fVar148 = fVar84 + fVar225;
      fVar253 = fVar177 * 0.0 * auVar120._0_4_;
      fVar259 = fVar213 * 0.0 * auVar120._4_4_;
      fVar269 = fVar203 * 0.0 * auVar120._8_4_;
      fVar271 = fVar208 * 0.0 * auVar120._12_4_;
      fVar161 = fVar243 - fVar244;
      fVar163 = fVar254 - fVar255;
      fVar164 = fVar257 - fVar258;
      fVar181 = fVar260 - fVar261;
      fVar177 = fVar117 + fVar253;
      fVar213 = fVar125 + fVar259;
      fVar203 = fVar128 + fVar269;
      fVar208 = fVar130 + fVar271;
      fVar242 = fVar133 - fVar198;
      fVar256 = fVar142 - fVar226;
      fVar262 = fVar144 - fVar228;
      fVar270 = fVar145 - fVar230;
      fVar210 = fVar118 - fVar234;
      fVar147 = fVar126 - fVar237;
      fVar160 = fVar129 - fVar239;
      fVar180 = fVar131 - fVar241;
      uVar48 = -(uint)(0.0 < (fVar242 * (fVar177 - fVar210) - fVar210 * (fVar279 - fVar242)) * 0.0 +
                             (fVar210 * (fVar227 - fVar161) - (fVar177 - fVar210) * fVar161) * 0.0 +
                             ((fVar279 - fVar242) * fVar161 - (fVar227 - fVar161) * fVar242));
      uVar49 = -(uint)(0.0 < (fVar256 * (fVar213 - fVar147) - fVar147 * (fVar283 - fVar256)) * 0.0 +
                             (fVar147 * (fVar229 - fVar163) - (fVar213 - fVar147) * fVar163) * 0.0 +
                             ((fVar283 - fVar256) * fVar163 - (fVar229 - fVar163) * fVar256));
      uVar50 = -(uint)(0.0 < (fVar262 * (fVar203 - fVar160) - fVar160 * (fVar146 - fVar262)) * 0.0 +
                             (fVar160 * (fVar231 - fVar164) - (fVar203 - fVar160) * fVar164) * 0.0 +
                             ((fVar146 - fVar262) * fVar164 - (fVar231 - fVar164) * fVar262));
      uVar51 = -(uint)(0.0 < (fVar270 * (fVar208 - fVar180) - fVar180 * (fVar148 - fVar270)) * 0.0 +
                             (fVar180 * (fVar232 - fVar181) - (fVar208 - fVar180) * fVar181) * 0.0 +
                             ((fVar148 - fVar270) * fVar181 - (fVar232 - fVar181) * fVar270));
      fVar244 = (float)((uint)(fVar204 - fVar87) & uVar48 | ~uVar48 & (uint)(fVar243 + fVar244));
      fVar254 = (float)((uint)(fVar209 - fVar112) & uVar49 | ~uVar49 & (uint)(fVar254 + fVar255));
      fVar257 = (float)((uint)(fVar211 - fVar114) & uVar50 | ~uVar50 & (uint)(fVar257 + fVar258));
      fVar260 = (float)((uint)(fVar212 - fVar115) & uVar51 | ~uVar51 & (uint)(fVar260 + fVar261));
      fVar199 = (float)((uint)(fVar53 - fVar199) & uVar48 | ~uVar48 & (uint)(fVar133 + fVar198));
      fVar201 = (float)((uint)(fVar81 - fVar201) & uVar49 | ~uVar49 & (uint)(fVar142 + fVar226));
      fVar202 = (float)((uint)(fVar83 - fVar202) & uVar50 | ~uVar50 & (uint)(fVar144 + fVar228));
      fVar204 = (float)((uint)(fVar84 - fVar225) & uVar51 | ~uVar51 & (uint)(fVar145 + fVar230));
      fVar198 = (float)((uint)(fVar117 - fVar253) & uVar48 | ~uVar48 & (uint)(fVar118 + fVar234));
      fVar226 = (float)((uint)(fVar125 - fVar259) & uVar49 | ~uVar49 & (uint)(fVar126 + fVar237));
      fVar228 = (float)((uint)(fVar128 - fVar269) & uVar50 | ~uVar50 & (uint)(fVar129 + fVar239));
      fVar230 = (float)((uint)(fVar130 - fVar271) & uVar51 | ~uVar51 & (uint)(fVar131 + fVar241));
      fVar83 = (float)((uint)fVar161 & uVar48 | ~uVar48 & (uint)fVar227);
      fVar84 = (float)((uint)fVar163 & uVar49 | ~uVar49 & (uint)fVar229);
      fVar133 = (float)((uint)fVar164 & uVar50 | ~uVar50 & (uint)fVar231);
      fVar142 = (float)((uint)fVar181 & uVar51 | ~uVar51 & (uint)fVar232);
      fVar253 = (float)((uint)fVar242 & uVar48 | ~uVar48 & (uint)fVar279);
      fVar259 = (float)((uint)fVar256 & uVar49 | ~uVar49 & (uint)fVar283);
      fVar269 = (float)((uint)fVar262 & uVar50 | ~uVar50 & (uint)fVar146);
      fVar271 = (float)((uint)fVar270 & uVar51 | ~uVar51 & (uint)fVar148);
      fVar209 = (float)((uint)fVar210 & uVar48 | ~uVar48 & (uint)fVar177);
      fVar211 = (float)((uint)fVar147 & uVar49 | ~uVar49 & (uint)fVar213);
      fVar212 = (float)((uint)fVar160 & uVar50 | ~uVar50 & (uint)fVar203);
      fVar243 = (float)((uint)fVar180 & uVar51 | ~uVar51 & (uint)fVar208);
      fVar144 = (float)((uint)fVar227 & uVar48 | ~uVar48 & (uint)fVar161) - fVar244;
      fVar145 = (float)((uint)fVar229 & uVar49 | ~uVar49 & (uint)fVar163) - fVar254;
      fVar161 = (float)((uint)fVar231 & uVar50 | ~uVar50 & (uint)fVar164) - fVar257;
      fVar163 = (float)((uint)fVar232 & uVar51 | ~uVar51 & (uint)fVar181) - fVar260;
      fVar242 = (float)((uint)fVar279 & uVar48 | ~uVar48 & (uint)fVar242) - fVar199;
      fVar256 = (float)((uint)fVar283 & uVar49 | ~uVar49 & (uint)fVar256) - fVar201;
      fVar262 = (float)((uint)fVar146 & uVar50 | ~uVar50 & (uint)fVar262) - fVar202;
      fVar270 = (float)((uint)fVar148 & uVar51 | ~uVar51 & (uint)fVar270) - fVar204;
      fVar177 = (float)((uint)fVar177 & uVar48 | ~uVar48 & (uint)fVar210) - fVar198;
      fVar213 = (float)((uint)fVar213 & uVar49 | ~uVar49 & (uint)fVar147) - fVar226;
      fVar203 = (float)((uint)fVar203 & uVar50 | ~uVar50 & (uint)fVar160) - fVar228;
      fVar208 = (float)((uint)fVar208 & uVar51 | ~uVar51 & (uint)fVar180) - fVar230;
      fVar225 = fVar244 - fVar83;
      fVar227 = fVar254 - fVar84;
      fVar229 = fVar257 - fVar133;
      fVar231 = fVar260 - fVar142;
      fVar279 = fVar199 - fVar253;
      fVar283 = fVar201 - fVar259;
      fVar53 = fVar202 - fVar269;
      fVar81 = fVar204 - fVar271;
      fVar210 = fVar198 - fVar209;
      fVar147 = fVar226 - fVar211;
      fVar160 = fVar228 - fVar212;
      fVar180 = fVar230 - fVar243;
      fVar146 = (fVar199 * fVar177 - fVar198 * fVar242) * 0.0 +
                (fVar198 * fVar144 - fVar244 * fVar177) * 0.0 +
                (fVar244 * fVar242 - fVar199 * fVar144);
      fVar148 = (fVar201 * fVar213 - fVar226 * fVar256) * 0.0 +
                (fVar226 * fVar145 - fVar254 * fVar213) * 0.0 +
                (fVar254 * fVar256 - fVar201 * fVar145);
      auVar137._4_4_ = fVar148;
      auVar137._0_4_ = fVar146;
      fVar164 = (fVar202 * fVar203 - fVar228 * fVar262) * 0.0 +
                (fVar228 * fVar161 - fVar257 * fVar203) * 0.0 +
                (fVar257 * fVar262 - fVar202 * fVar161);
      fVar181 = (fVar204 * fVar208 - fVar230 * fVar270) * 0.0 +
                (fVar230 * fVar163 - fVar260 * fVar208) * 0.0 +
                (fVar260 * fVar270 - fVar204 * fVar163);
      auVar273._0_4_ =
           (fVar253 * fVar210 - fVar209 * fVar279) * 0.0 +
           (fVar209 * fVar225 - fVar83 * fVar210) * 0.0 + (fVar83 * fVar279 - fVar253 * fVar225);
      auVar273._4_4_ =
           (fVar259 * fVar147 - fVar211 * fVar283) * 0.0 +
           (fVar211 * fVar227 - fVar84 * fVar147) * 0.0 + (fVar84 * fVar283 - fVar259 * fVar227);
      auVar273._8_4_ =
           (fVar269 * fVar160 - fVar212 * fVar53) * 0.0 +
           (fVar212 * fVar229 - fVar133 * fVar160) * 0.0 + (fVar133 * fVar53 - fVar269 * fVar229);
      auVar273._12_4_ =
           (fVar271 * fVar180 - fVar243 * fVar81) * 0.0 +
           (fVar243 * fVar231 - fVar142 * fVar180) * 0.0 + (fVar142 * fVar81 - fVar271 * fVar231);
      auVar137._8_4_ = fVar164;
      auVar137._12_4_ = fVar181;
      auVar54 = maxps(auVar137,auVar273);
      bVar29 = auVar54._0_4_ <= 0.0 && bVar29;
      auVar138._0_4_ = -(uint)bVar29;
      bVar30 = auVar54._4_4_ <= 0.0 && bVar30;
      auVar138._4_4_ = -(uint)bVar30;
      bVar28 = auVar54._8_4_ <= 0.0 && bVar28;
      auVar138._8_4_ = -(uint)bVar28;
      bVar27 = auVar54._12_4_ <= 0.0 && bVar27;
      auVar138._12_4_ = -(uint)bVar27;
      iVar36 = movmskps((uint)uStack_2f0,auVar138);
      if (iVar36 == 0) {
LAB_0033c8cc:
        auVar74._8_8_ = uStack_390;
        auVar74._0_8_ = local_398;
      }
      else {
        fVar253 = fVar279 * fVar177 - fVar210 * fVar242;
        fVar259 = fVar283 * fVar213 - fVar147 * fVar256;
        fVar269 = fVar53 * fVar203 - fVar160 * fVar262;
        fVar271 = fVar81 * fVar208 - fVar180 * fVar270;
        auVar10._4_4_ = fVar145;
        auVar10._0_4_ = fVar144;
        auVar10._8_4_ = fVar161;
        auVar10._12_4_ = fVar163;
        fVar177 = fVar210 * fVar144 - fVar177 * fVar225;
        fVar210 = fVar147 * fVar145 - fVar213 * fVar227;
        fVar147 = fVar160 * fVar161 - fVar203 * fVar229;
        fVar160 = fVar180 * fVar163 - fVar208 * fVar231;
        fVar242 = fVar225 * fVar242 - fVar279 * fVar144;
        fVar256 = fVar227 * fVar256 - fVar283 * fVar145;
        fVar262 = fVar229 * fVar262 - fVar53 * fVar161;
        fVar270 = fVar231 * fVar270 - fVar81 * fVar163;
        auVar171._0_4_ = fVar253 * 0.0 + fVar177 * 0.0 + fVar242;
        auVar171._4_4_ = fVar259 * 0.0 + fVar210 * 0.0 + fVar256;
        auVar171._8_4_ = fVar269 * 0.0 + fVar147 * 0.0 + fVar262;
        auVar171._12_4_ = fVar271 * 0.0 + fVar160 * 0.0 + fVar270;
        auVar54 = rcpps(auVar10,auVar171);
        fVar213 = auVar54._0_4_;
        fVar203 = auVar54._4_4_;
        fVar208 = auVar54._8_4_;
        fVar180 = auVar54._12_4_;
        fVar213 = (1.0 - auVar171._0_4_ * fVar213) * fVar213 + fVar213;
        fVar203 = (1.0 - auVar171._4_4_ * fVar203) * fVar203 + fVar203;
        fVar208 = (1.0 - auVar171._8_4_ * fVar208) * fVar208 + fVar208;
        fVar180 = (1.0 - auVar171._12_4_ * fVar180) * fVar180 + fVar180;
        fVar198 = (fVar198 * fVar242 + fVar199 * fVar177 + fVar244 * fVar253) * fVar213;
        fVar210 = (fVar226 * fVar256 + fVar201 * fVar210 + fVar254 * fVar259) * fVar203;
        aVar250.v[1] = fVar210;
        aVar250.v[0] = fVar198;
        fVar147 = (fVar228 * fVar262 + fVar202 * fVar147 + fVar257 * fVar269) * fVar208;
        fVar160 = (fVar230 * fVar270 + fVar204 * fVar160 + fVar260 * fVar271) * fVar180;
        fVar177 = *(float *)(ray + k * 4 + 0x80);
        bVar29 = (fVar127 <= fVar198 && fVar198 <= fVar177) && bVar29;
        auVar154._0_4_ = -(uint)bVar29;
        bVar30 = (fVar127 <= fVar210 && fVar210 <= fVar177) && bVar30;
        auVar154._4_4_ = -(uint)bVar30;
        bVar28 = (fVar127 <= fVar147 && fVar147 <= fVar177) && bVar28;
        auVar154._8_4_ = -(uint)bVar28;
        bVar27 = (fVar127 <= fVar160 && fVar160 <= fVar177) && bVar27;
        auVar154._12_4_ = -(uint)bVar27;
        iVar36 = movmskps(iVar36,auVar154);
        if (iVar36 == 0) goto LAB_0033c8cc;
        auVar155._0_8_ =
             CONCAT44(-(uint)(auVar171._4_4_ != 0.0 && bVar30),
                      -(uint)(auVar171._0_4_ != 0.0 && bVar29));
        auVar155._8_4_ = -(uint)(auVar171._8_4_ != 0.0 && bVar28);
        auVar155._12_4_ = -(uint)(auVar171._12_4_ != 0.0 && bVar27);
        iVar36 = movmskps(iVar36,auVar155);
        auVar74._8_8_ = uStack_390;
        auVar74._0_8_ = local_398;
        if (iVar36 != 0) {
          fVar146 = fVar146 * fVar213;
          fVar148 = fVar148 * fVar203;
          fVar164 = fVar164 * fVar208;
          fVar181 = fVar181 * fVar180;
          auVar73._0_4_ = ~uVar48 & (uint)fVar146;
          auVar73._4_4_ = ~uVar49 & (uint)fVar148;
          auVar73._8_4_ = ~uVar50 & (uint)fVar164;
          auVar73._12_4_ = ~uVar51 & (uint)fVar181;
          auVar216._0_4_ = (uint)(1.0 - fVar146) & uVar48;
          auVar216._4_4_ = (uint)(1.0 - fVar148) & uVar49;
          auVar216._8_4_ = (uint)(1.0 - fVar164) & uVar50;
          auVar216._12_4_ = (uint)(1.0 - fVar181) & uVar51;
          aVar217 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar216 | auVar73);
          local_278 = (float)(~uVar48 & (uint)(auVar273._0_4_ * fVar213) |
                             (uint)(1.0 - auVar273._0_4_ * fVar213) & uVar48);
          fStack_274 = (float)(~uVar49 & (uint)(auVar273._4_4_ * fVar203) |
                              (uint)(1.0 - auVar273._4_4_ * fVar203) & uVar49);
          fStack_270 = (float)(~uVar50 & (uint)(auVar273._8_4_ * fVar208) |
                              (uint)(1.0 - auVar273._8_4_ * fVar208) & uVar50);
          fStack_26c = (float)(~uVar51 & (uint)(auVar273._12_4_ * fVar180) |
                              (uint)(1.0 - auVar273._12_4_ * fVar180) & uVar51);
          auVar74._8_4_ = auVar155._8_4_;
          auVar74._0_8_ = auVar155._0_8_;
          auVar74._12_4_ = auVar155._12_4_;
          aVar250.v[2] = fVar147;
          aVar250.v[3] = fVar160;
          aVar248 = aVar250;
        }
      }
      uVar48 = movmskps(iVar36,auVar74);
      pauVar34 = (undefined1 (*) [16])(ulong)uVar48;
      if (uVar48 == 0) {
        uVar43 = 0;
      }
      else {
        fVar166 = (auVar120._0_4_ - fVar166) * aVar217.v[0] + fVar166;
        fVar176 = (auVar120._4_4_ - fVar176) * aVar217.v[1] + fVar176;
        fVar178 = (auVar120._8_4_ - fVar178) * aVar217.v[2] + fVar178;
        fVar179 = (auVar120._12_4_ - fVar179) * aVar217.v[3] + fVar179;
        fVar177 = *(float *)((long)local_330->ray_space + k * 4 + -0x10);
        bhit.valid.field_0._0_4_ =
             -(uint)(fVar177 * (fVar166 + fVar166) < aVar248.v[0]) & auVar74._0_4_;
        bhit.valid.field_0._4_4_ =
             -(uint)(fVar177 * (fVar176 + fVar176) < aVar248.v[1]) & auVar74._4_4_;
        bhit.valid.field_0._8_4_ =
             -(uint)(fVar177 * (fVar178 + fVar178) < aVar248.v[2]) & auVar74._8_4_;
        bhit.valid.field_0._12_4_ =
             -(uint)(fVar177 * (fVar179 + fVar179) < aVar248.v[3]) & auVar74._12_4_;
        uVar48 = movmskps((int)local_330,(undefined1  [16])bhit.valid.field_0);
        pauVar34 = (undefined1 (*) [16])(ulong)uVar48;
        if (uVar48 != 0) {
          local_278 = local_278 + local_278 + -1.0;
          fStack_274 = fStack_274 + fStack_274 + -1.0;
          fStack_270 = fStack_270 + fStack_270 + -1.0;
          fStack_26c = fStack_26c + fStack_26c + -1.0;
          bhit.i = 0;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (uVar43 = CONCAT71((int7)((ulong)context->args >> 8),1),
               pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0033c884;
            fVar177 = 1.0 / fVar141;
            bhit.vu.field_0.v[0] = fVar177 * (aVar217.v[0] + 0.0);
            bhit.vu.field_0.v[1] = fVar177 * (aVar217.v[1] + 1.0);
            bhit.vu.field_0.v[2] = fVar177 * (aVar217.v[2] + 2.0);
            bhit.vu.field_0.v[3] = fVar177 * (aVar217.v[3] + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_274,local_278);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_26c,fStack_270);
            bhit.vt.field_0 = aVar248;
            pGVar39 = (Geometry *)(ulong)(byte)uVar48;
            uVar43 = 0;
            if (pGVar39 != (Geometry *)0x0) {
              for (; ((byte)uVar48 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
              }
            }
            local_468 = CONCAT44((uint)uStack_2f0,(uint)uStack_2f0);
            uStack_460._0_4_ = (float)(uint)uStack_2f0;
            uStack_460._4_4_ = (uint)uStack_2f0;
            auVar54 = *local_338;
            pauVar34 = local_338;
            bhit.U.field_0 = aVar217;
            bhit.V.field_0.v[0] = local_278;
            bhit.V.field_0.v[1] = fStack_274;
            bhit.V.field_0.v[2] = fStack_270;
            bhit.V.field_0.v[3] = fStack_26c;
            bhit.T.field_0 = aVar248;
            bhit.N = iVar6;
            bhit.curve3D.v2.field_0.m128[0] = fVar80;
            bhit.curve3D.v2.field_0.m128[1] = fVar82;
            bhit.curve3D.v2.field_0.m128[2] = fVar86;
            bhit.curve3D.v2.field_0.m128[3] = fVar111;
            while (pGVar39 != (Geometry *)0x0) {
              fVar177 = bhit.vu.field_0.v[uVar43];
              uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
              local_d8 = bhit.vv.field_0.v[uVar43];
              *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar43];
              fVar210 = 1.0 - fVar177;
              fVar213 = fVar177 * fVar210 * 4.0;
              fVar147 = (fVar210 * fVar210 + fVar213) * 0.5;
              fVar203 = fVar177 * fVar177 * 0.5;
              fVar208 = (-fVar177 * fVar177 - fVar213) * 0.5;
              args.context = context->user;
              fVar213 = -fVar210 * fVar210 * 0.5;
              local_118 = fVar213 * local_388 +
                          fVar208 * local_348 + fVar147 * fVar80 + fVar203 * fVar113;
              local_108 = fVar213 * fStack_384 +
                          fVar208 * fStack_344 + fVar147 * fVar82 + fVar203 * fVar116;
              local_f8 = fVar213 * fStack_380 +
                         fVar208 * fStack_340 + fVar147 * fVar86 + fVar203 * fVar124;
              fStack_114 = local_118;
              fStack_110 = local_118;
              fStack_10c = local_118;
              fStack_104 = local_108;
              fStack_100 = local_108;
              fStack_fc = local_108;
              fStack_f4 = local_f8;
              fStack_f0 = local_f8;
              fStack_ec = local_f8;
              local_e8._4_4_ = fVar177;
              local_e8._0_4_ = fVar177;
              fStack_e0 = fVar177;
              fStack_dc = fVar177;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              local_c8 = local_468;
              uStack_c0 = uStack_460;
              local_b8 = CONCAT44(uVar47,uVar47);
              uStack_b0 = CONCAT44(uVar47,uVar47);
              local_a8 = (args.context)->instID[0];
              uStack_a4 = local_a8;
              uStack_a0 = local_a8;
              uStack_9c = local_a8;
              local_98 = (args.context)->instPrimID[0];
              uStack_94 = local_98;
              uStack_90 = local_98;
              uStack_8c = local_98;
              args.valid = (int *)local_3b8;
              pRVar37 = (RTCIntersectArguments *)pGVar7->userPtr;
              args.hit = (RTCHitN *)&local_118;
              args.N = 4;
              p_Var32 = pGVar7->occlusionFilterN;
              local_3b8 = auVar54;
              args.geometryUserPtr = pRVar37;
              args.ray = (RTCRayN *)ray;
              if (p_Var32 != (RTCFilterFunctionN)0x0) {
                p_Var32 = (RTCFilterFunctionN)(*p_Var32)(&args);
              }
              auVar105._0_4_ = -(uint)(local_3b8._0_4_ == 0);
              auVar105._4_4_ = -(uint)(local_3b8._4_4_ == 0);
              auVar105._8_4_ = -(uint)(local_3b8._8_4_ == 0);
              auVar105._12_4_ = -(uint)(local_3b8._12_4_ == 0);
              uVar48 = movmskps((int)p_Var32,auVar105);
              pRVar33 = (RTCRayN *)(ulong)(uVar48 ^ 0xf);
              if ((uVar48 ^ 0xf) == 0) {
                auVar105 = auVar105 ^ _DAT_01f46b70;
              }
              else {
                pRVar37 = context->args;
                if ((pRVar37->filter != (RTCFilterFunctionN)0x0) &&
                   (((pRVar37->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*pRVar37->filter)(&args);
                }
                auVar75._0_4_ = -(uint)(local_3b8._0_4_ == 0);
                auVar75._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                auVar75._8_4_ = -(uint)(local_3b8._8_4_ == 0);
                auVar75._12_4_ = -(uint)(local_3b8._12_4_ == 0);
                auVar105 = auVar75 ^ _DAT_01f46b70;
                *(undefined1 (*) [16])(args.ray + 0x80) =
                     ~auVar75 & _DAT_01f45a40 | *(undefined1 (*) [16])(args.ray + 0x80) & auVar75;
                pRVar33 = args.ray;
              }
              auVar106._0_4_ = auVar105._0_4_ << 0x1f;
              auVar106._4_4_ = auVar105._4_4_ << 0x1f;
              auVar106._8_4_ = auVar105._8_4_ << 0x1f;
              auVar106._12_4_ = auVar105._12_4_ << 0x1f;
              iVar36 = movmskps((int)pRVar33,auVar106);
              pauVar34 = (undefined1 (*) [16])(uVar43 & 0xffffffff);
              if (iVar36 != 0) {
                uVar43 = CONCAT71((int7)((ulong)pRVar37 >> 8),1);
                goto LAB_0033c884;
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar46;
              pGVar39 = (Geometry *)((ulong)pGVar39 ^ 1L << (uVar43 & 0x3f));
              uVar43 = 0;
              if (pGVar39 != (Geometry *)0x0) {
                for (; ((ulong)pGVar39 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
            }
          }
        }
        uVar43 = 0;
      }
    }
LAB_0033c884:
    uVar46 = SUB84(pauVar34,0);
    if (4 < iVar6) {
      local_68 = iVar6;
      iStack_64 = iVar6;
      iStack_60 = iVar6;
      iStack_5c = iVar6;
      local_88 = 1.0 / fVar141;
      fStack_84 = local_88;
      fStack_80 = local_88;
      fStack_7c = local_88;
      local_78 = (undefined4)local_3a0;
      uStack_74 = (undefined4)local_3a0;
      uStack_70 = (undefined4)local_3a0;
      uStack_6c = (undefined4)local_3a0;
      local_2f8 = CONCAT44((uint)uStack_2f0,(uint)uStack_2f0);
      uStack_2f0._4_4_ = (uint)uStack_2f0;
      local_378._4_4_ = local_378._0_4_;
      fStack_370 = (float)local_378._0_4_;
      fStack_36c = (float)local_378._0_4_;
      for (lVar41 = 4; uVar46 = SUB84(pauVar34,0), lVar41 < iVar6; lVar41 = lVar41 + 4) {
        bhit.i = (int)lVar41;
        pauVar2 = (undefined1 (*) [12])(bspline_basis0 + lVar41 * 4 + lVar40);
        fVar141 = *(float *)*pauVar2;
        fVar177 = *(float *)(*pauVar2 + 4);
        fVar213 = *(float *)(*pauVar2 + 8);
        auVar13 = *pauVar2;
        fVar203 = *(float *)pauVar2[1];
        pauVar2 = (undefined1 (*) [12])(lVar40 + 0x21fffac + lVar41 * 4);
        fVar208 = *(float *)*pauVar2;
        fVar210 = *(float *)(*pauVar2 + 4);
        fVar147 = *(float *)(*pauVar2 + 8);
        auVar12 = *pauVar2;
        fVar160 = *(float *)pauVar2[1];
        pfVar1 = (float *)(lVar40 + 0x2200430 + lVar41 * 4);
        fVar180 = *pfVar1;
        fVar198 = pfVar1[1];
        fVar226 = pfVar1[2];
        fVar228 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x22008b4 + lVar41 * 4);
        fVar230 = *pfVar1;
        fVar242 = pfVar1[1];
        fVar253 = pfVar1[2];
        fVar256 = pfVar1[3];
        fVar164 = fVar220 * fVar141 + local_358 * fVar208 + fVar218 * fVar180 + fVar165 * fVar230;
        fVar179 = fVar220 * fVar177 + fStack_354 * fVar210 + fVar218 * fVar198 + fVar165 * fVar242;
        fVar181 = fVar220 * fVar213 + fStack_350 * fVar147 + fVar218 * fVar226 + fVar165 * fVar253;
        fVar199 = fVar220 * fVar203 + fStack_34c * fVar160 + fVar218 * fVar228 + fVar165 * fVar256;
        fVar211 = fVar223 * fVar141 + local_368 * fVar208 + fVar219 * fVar180 + fVar175 * fVar230;
        fVar243 = fVar223 * fVar177 + fStack_364 * fVar210 + fVar219 * fVar198 + fVar175 * fVar242;
        fVar257 = fVar223 * fVar213 + fStack_360 * fVar147 + fVar219 * fVar226 + fVar175 * fVar253;
        fVar225 = fVar223 * fVar203 + fStack_35c * fVar160 + fVar219 * fVar228 + fVar175 * fVar256;
        auVar205._0_4_ =
             fVar143 * fVar141 + fVar52 * fVar208 + fVar111 * fVar180 + local_58 * fVar230;
        auVar205._4_4_ =
             fVar143 * fVar177 + fVar52 * fVar210 + fVar111 * fVar198 + fStack_54 * fVar242;
        auVar205._8_4_ =
             fVar143 * fVar213 + fVar52 * fVar147 + fVar111 * fVar226 + fStack_50 * fVar253;
        auVar205._12_4_ =
             fVar143 * fVar203 + fVar52 * fVar160 + fVar111 * fVar228 + fStack_4c * fVar256;
        pauVar34 = (undefined1 (*) [16])(bspline_basis1 + lVar40);
        pfVar1 = (float *)(*pauVar34 + lVar41 * 4);
        fVar141 = *pfVar1;
        fVar177 = pfVar1[1];
        fVar213 = pfVar1[2];
        fVar208 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x22023cc + lVar41 * 4);
        fVar210 = *pfVar1;
        fVar147 = pfVar1[1];
        fVar259 = pfVar1[2];
        fVar262 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x2202850 + lVar41 * 4);
        fVar269 = *pfVar1;
        fVar270 = pfVar1[1];
        fVar271 = pfVar1[2];
        fVar279 = pfVar1[3];
        pfVar1 = (float *)(lVar40 + 0x2202cd4 + lVar41 * 4);
        fVar283 = *pfVar1;
        fVar53 = pfVar1[1];
        fVar81 = pfVar1[2];
        fVar83 = pfVar1[3];
        fVar161 = fVar220 * fVar141 + local_358 * fVar210 + fVar218 * fVar269 + fVar165 * fVar283;
        fVar176 = fVar220 * fVar177 + fStack_354 * fVar147 + fVar218 * fVar270 + fVar165 * fVar53;
        fVar163 = fVar220 * fVar213 + fStack_350 * fVar259 + fVar218 * fVar271 + fVar165 * fVar81;
        fVar178 = fVar220 * fVar208 + fStack_34c * fVar262 + fVar218 * fVar279 + fVar165 * fVar83;
        fVar201 = fVar223 * fVar141 + local_368 * fVar210 + fVar219 * fVar269 + fVar175 * fVar283;
        fVar202 = fVar223 * fVar177 + fStack_364 * fVar147 + fVar219 * fVar270 + fVar175 * fVar53;
        fVar204 = fVar223 * fVar213 + fStack_360 * fVar259 + fVar219 * fVar271 + fVar175 * fVar81;
        fVar209 = fVar223 * fVar208 + fStack_35c * fVar262 + fVar219 * fVar279 + fVar175 * fVar83;
        auVar266._0_4_ =
             fVar143 * fVar141 + fVar52 * fVar210 + fVar111 * fVar269 + local_58 * fVar283;
        auVar266._4_4_ =
             fVar143 * fVar177 + fVar52 * fVar147 + fVar111 * fVar270 + fStack_54 * fVar53;
        auVar266._8_4_ =
             fVar143 * fVar213 + fVar52 * fVar259 + fVar111 * fVar271 + fStack_50 * fVar81;
        auVar266._12_4_ =
             fVar143 * fVar208 + fVar52 * fVar262 + fVar111 * fVar279 + fStack_4c * fVar83;
        fVar145 = fVar161 - fVar164;
        fVar146 = fVar176 - fVar179;
        fVar148 = fVar163 - fVar181;
        fVar166 = fVar178 - fVar199;
        fVar84 = fVar201 - fVar211;
        fVar133 = fVar202 - fVar243;
        fVar142 = fVar204 - fVar257;
        fVar144 = fVar209 - fVar225;
        fVar212 = fVar211 * fVar145 - fVar164 * fVar84;
        fVar254 = fVar243 * fVar146 - fVar179 * fVar133;
        fVar260 = fVar257 * fVar148 - fVar181 * fVar142;
        fVar227 = fVar225 * fVar166 - fVar199 * fVar144;
        auVar54 = maxps(auVar205,auVar266);
        bVar27 = fVar212 * fVar212 <=
                 auVar54._0_4_ * auVar54._0_4_ * (fVar145 * fVar145 + fVar84 * fVar84) &&
                 bhit.i < local_68;
        auVar251._0_4_ = -(uint)bVar27;
        bVar28 = fVar254 * fVar254 <=
                 auVar54._4_4_ * auVar54._4_4_ * (fVar146 * fVar146 + fVar133 * fVar133) &&
                 (int)(bhit.i | 1U) < iStack_64;
        auVar251._4_4_ = -(uint)bVar28;
        bVar29 = fVar260 * fVar260 <=
                 auVar54._8_4_ * auVar54._8_4_ * (fVar148 * fVar148 + fVar142 * fVar142) &&
                 (int)(bhit.i | 2U) < iStack_60;
        auVar251._8_4_ = -(uint)bVar29;
        bVar30 = fVar227 * fVar227 <=
                 auVar54._12_4_ * auVar54._12_4_ * (fVar166 * fVar166 + fVar144 * fVar144) &&
                 (int)(bhit.i | 3U) < iStack_5c;
        auVar251._12_4_ = -(uint)bVar30;
        uVar47 = movmskps((int)pGVar39,auVar251);
        pGVar39 = (Geometry *)(ulong)uVar47;
        if (uVar47 == 0) {
          uVar38 = uVar43 & 0xffffffff;
        }
        else {
          fVar261 = fVar283 * fVar132 + fVar269 * fVar162 + fVar210 * fVar200 + fVar141 * fVar224;
          fVar112 = fVar53 * fVar132 + fVar270 * fVar162 + fVar147 * fVar200 + fVar177 * fVar224;
          fVar115 = fVar81 * fVar132 + fVar271 * fVar162 + fVar259 * fVar200 + fVar213 * fVar224;
          fVar118 = fVar83 * fVar132 + fVar279 * fVar162 + fVar262 * fVar200 + fVar208 * fVar224;
          local_418 = auVar13._0_4_;
          fStack_414 = auVar13._4_4_;
          fStack_410 = auVar13._8_4_;
          local_258 = auVar12._0_4_;
          fStack_254 = auVar12._4_4_;
          fStack_250 = auVar12._8_4_;
          fVar87 = fVar230 * fVar132 + fVar180 * fVar162 + local_258 * fVar200 + local_418 * fVar224
          ;
          fVar114 = fVar242 * fVar132 + fVar198 * fVar162 + fStack_254 * fVar200 +
                    fStack_414 * fVar224;
          fVar117 = fVar253 * fVar132 + fVar226 * fVar162 + fStack_250 * fVar200 +
                    fStack_410 * fVar224;
          fVar125 = fVar256 * fVar132 + fVar228 * fVar162 + fVar160 * fVar200 + fVar203 * fVar224;
          pfVar1 = (float *)(lVar40 + 0x2200d38 + lVar41 * 4);
          fVar141 = *pfVar1;
          fVar177 = pfVar1[1];
          fVar213 = pfVar1[2];
          fVar203 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x22011bc + lVar41 * 4);
          fVar208 = *pfVar1;
          fVar210 = pfVar1[1];
          fVar147 = pfVar1[2];
          fVar160 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x2201640 + lVar41 * 4);
          fVar180 = *pfVar1;
          fVar198 = pfVar1[1];
          fVar226 = pfVar1[2];
          fVar228 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x2201ac4 + lVar41 * 4);
          fVar230 = *pfVar1;
          fVar242 = pfVar1[1];
          fVar253 = pfVar1[2];
          fVar256 = pfVar1[3];
          fVar126 = fVar220 * fVar141 + local_358 * fVar208 + fVar218 * fVar180 + fVar165 * fVar230;
          fVar128 = fVar220 * fVar177 + fStack_354 * fVar210 + fVar218 * fVar198 + fVar165 * fVar242
          ;
          fVar129 = fVar220 * fVar213 + fStack_350 * fVar147 + fVar218 * fVar226 + fVar165 * fVar253
          ;
          fVar130 = fVar220 * fVar203 + fStack_34c * fVar160 + fVar218 * fVar228 + fVar165 * fVar256
          ;
          fVar232 = fVar223 * fVar141 + local_368 * fVar208 + fVar219 * fVar180 + fVar175 * fVar230;
          fVar244 = fVar223 * fVar177 + fStack_364 * fVar210 + fVar219 * fVar198 + fVar175 * fVar242
          ;
          fVar255 = fVar223 * fVar213 + fStack_360 * fVar147 + fVar219 * fVar226 + fVar175 * fVar253
          ;
          fVar258 = fVar223 * fVar203 + fStack_35c * fVar160 + fVar219 * fVar228 + fVar175 * fVar256
          ;
          pfVar1 = (float *)(lVar40 + 0x2203158 + lVar41 * 4);
          fVar259 = *pfVar1;
          fVar262 = pfVar1[1];
          fVar269 = pfVar1[2];
          fVar270 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x2203a60 + lVar41 * 4);
          fVar271 = *pfVar1;
          fVar279 = pfVar1[1];
          fVar283 = pfVar1[2];
          fVar53 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x2203ee4 + lVar41 * 4);
          fVar81 = *pfVar1;
          fVar83 = pfVar1[1];
          fVar212 = pfVar1[2];
          fVar254 = pfVar1[3];
          pfVar1 = (float *)(lVar40 + 0x22035dc + lVar41 * 4);
          fVar260 = *pfVar1;
          fVar227 = pfVar1[1];
          fVar229 = pfVar1[2];
          fVar231 = pfVar1[3];
          fVar131 = fVar220 * fVar259 + local_358 * fVar260 + fVar218 * fVar271 + fVar165 * fVar81;
          fVar234 = fVar220 * fVar262 + fStack_354 * fVar227 + fVar218 * fVar279 + fVar165 * fVar83;
          fVar237 = fVar220 * fVar269 + fStack_350 * fVar229 + fVar218 * fVar283 + fVar165 * fVar212
          ;
          fVar239 = fVar220 * fVar270 + fStack_34c * fVar231 + fVar218 * fVar53 + fVar165 * fVar254;
          fVar241 = fVar223 * fVar259 + local_368 * fVar260 + fVar219 * fVar271 + fVar175 * fVar81;
          fVar272 = fVar223 * fVar262 + fStack_364 * fVar227 + fVar219 * fVar279 + fVar175 * fVar83;
          fVar275 = fVar223 * fVar269 + fStack_360 * fVar229 + fVar219 * fVar283 + fVar175 * fVar212
          ;
          fVar276 = fVar223 * fVar270 + fStack_35c * fVar231 + fVar219 * fVar53 + fVar175 * fVar254;
          auVar252._0_8_ = CONCAT44(fVar128,fVar126) & 0x7fffffff7fffffff;
          auVar252._8_4_ = ABS(fVar129);
          auVar252._12_4_ = ABS(fVar130);
          auVar172._0_8_ = CONCAT44(fVar244,fVar232) & 0x7fffffff7fffffff;
          auVar172._8_4_ = ABS(fVar255);
          auVar172._12_4_ = ABS(fVar258);
          auVar54 = maxps(auVar252,auVar172);
          auVar267._0_8_ =
               CONCAT44(fVar177 * fVar224 +
                        fVar210 * fVar200 + fVar198 * fVar162 + fVar242 * fVar132,
                        fVar141 * fVar224 +
                        fVar208 * fVar200 + fVar180 * fVar162 + fVar230 * fVar132) &
               0x7fffffff7fffffff;
          auVar267._8_4_ =
               ABS(fVar213 * fVar224 + fVar147 * fVar200 + fVar226 * fVar162 + fVar253 * fVar132);
          auVar267._12_4_ =
               ABS(fVar203 * fVar224 + fVar160 * fVar200 + fVar228 * fVar162 + fVar256 * fVar132);
          auVar54 = maxps(auVar54,auVar267);
          uVar47 = -(uint)((float)local_378._0_4_ <= auVar54._0_4_);
          uVar48 = -(uint)((float)local_378._4_4_ <= auVar54._4_4_);
          uVar49 = -(uint)(fStack_370 <= auVar54._8_4_);
          uVar50 = -(uint)(fStack_36c <= auVar54._12_4_);
          auVar173._0_4_ = ~uVar47 & (uint)fVar145;
          auVar173._4_4_ = ~uVar48 & (uint)fVar146;
          auVar173._8_4_ = ~uVar49 & (uint)fVar148;
          auVar173._12_4_ = ~uVar50 & (uint)fVar166;
          auVar235._0_4_ = (uint)fVar126 & uVar47;
          auVar235._4_4_ = (uint)fVar128 & uVar48;
          auVar235._8_4_ = (uint)fVar129 & uVar49;
          auVar235._12_4_ = (uint)fVar130 & uVar50;
          auVar235 = auVar235 | auVar173;
          fVar198 = (float)(~uVar47 & (uint)fVar84 | (uint)fVar232 & uVar47);
          fVar228 = (float)(~uVar48 & (uint)fVar133 | (uint)fVar244 & uVar48);
          fVar232 = (float)(~uVar49 & (uint)fVar142 | (uint)fVar255 & uVar49);
          fVar244 = (float)(~uVar50 & (uint)fVar144 | (uint)fVar258 & uVar50);
          auVar268._0_8_ = CONCAT44(fVar234,fVar131) & 0x7fffffff7fffffff;
          auVar268._8_4_ = ABS(fVar237);
          auVar268._12_4_ = ABS(fVar239);
          auVar121._0_8_ = CONCAT44(fVar272,fVar241) & 0x7fffffff7fffffff;
          auVar121._8_4_ = ABS(fVar275);
          auVar121._12_4_ = ABS(fVar276);
          auVar54 = maxps(auVar268,auVar121);
          auVar76._0_8_ =
               CONCAT44(fVar262 * fVar224 + fVar227 * fVar200 + fVar279 * fVar162 + fVar83 * fVar132
                        ,fVar259 * fVar224 +
                         fVar260 * fVar200 + fVar271 * fVar162 + fVar81 * fVar132) &
               0x7fffffff7fffffff;
          auVar76._8_4_ =
               ABS(fVar269 * fVar224 + fVar229 * fVar200 + fVar283 * fVar162 + fVar212 * fVar132);
          auVar76._12_4_ =
               ABS(fVar270 * fVar224 + fVar231 * fVar200 + fVar53 * fVar162 + fVar254 * fVar132);
          auVar54 = maxps(auVar54,auVar76);
          uVar47 = -(uint)((float)local_378._0_4_ <= auVar54._0_4_);
          uVar48 = -(uint)((float)local_378._4_4_ <= auVar54._4_4_);
          uVar49 = -(uint)(fStack_370 <= auVar54._8_4_);
          uVar50 = -(uint)(fStack_36c <= auVar54._12_4_);
          fVar145 = (float)((uint)fVar131 & uVar47 | ~uVar47 & (uint)fVar145);
          fVar212 = (float)((uint)fVar234 & uVar48 | ~uVar48 & (uint)fVar146);
          fVar148 = (float)((uint)fVar237 & uVar49 | ~uVar49 & (uint)fVar148);
          fVar231 = (float)((uint)fVar239 & uVar50 | ~uVar50 & (uint)fVar166);
          fVar259 = (float)(~uVar47 & (uint)fVar84 | (uint)fVar241 & uVar47);
          fVar269 = (float)(~uVar48 & (uint)fVar133 | (uint)fVar272 & uVar48);
          fVar271 = (float)(~uVar49 & (uint)fVar142 | (uint)fVar275 & uVar49);
          fVar283 = (float)(~uVar50 & (uint)fVar144 | (uint)fVar276 & uVar50);
          fVar160 = auVar235._0_4_;
          fVar141 = auVar235._4_4_;
          fVar177 = auVar235._8_4_;
          fVar213 = auVar235._12_4_;
          auVar156._0_4_ = fVar198 * fVar198 + fVar160 * fVar160;
          auVar156._4_4_ = fVar228 * fVar228 + fVar141 * fVar141;
          auVar156._8_4_ = fVar232 * fVar232 + fVar177 * fVar177;
          auVar156._12_4_ = fVar244 * fVar244 + fVar213 * fVar213;
          auVar54 = rsqrtps(auVar173,auVar156);
          fVar203 = auVar54._0_4_;
          fVar208 = auVar54._4_4_;
          fVar210 = auVar54._8_4_;
          fVar147 = auVar54._12_4_;
          auVar174._0_4_ = fVar203 * fVar203 * auVar156._0_4_ * 0.5 * fVar203;
          auVar174._4_4_ = fVar208 * fVar208 * auVar156._4_4_ * 0.5 * fVar208;
          auVar174._8_4_ = fVar210 * fVar210 * auVar156._8_4_ * 0.5 * fVar210;
          auVar174._12_4_ = fVar147 * fVar147 * auVar156._12_4_ * 0.5 * fVar147;
          fVar230 = fVar203 * 1.5 - auVar174._0_4_;
          fVar242 = fVar208 * 1.5 - auVar174._4_4_;
          fVar253 = fVar210 * 1.5 - auVar174._8_4_;
          fVar256 = fVar147 * 1.5 - auVar174._12_4_;
          auVar157._0_4_ = fVar259 * fVar259 + fVar145 * fVar145;
          auVar157._4_4_ = fVar269 * fVar269 + fVar212 * fVar212;
          auVar157._8_4_ = fVar271 * fVar271 + fVar148 * fVar148;
          auVar157._12_4_ = fVar283 * fVar283 + fVar231 * fVar231;
          auVar54 = rsqrtps(auVar174,auVar157);
          fVar203 = auVar54._0_4_;
          fVar208 = auVar54._4_4_;
          fVar210 = auVar54._8_4_;
          fVar147 = auVar54._12_4_;
          fVar180 = fVar203 * 1.5 - fVar203 * fVar203 * auVar157._0_4_ * 0.5 * fVar203;
          fVar208 = fVar208 * 1.5 - fVar208 * fVar208 * auVar157._4_4_ * 0.5 * fVar208;
          fVar226 = fVar210 * 1.5 - fVar210 * fVar210 * auVar157._8_4_ * 0.5 * fVar210;
          fVar147 = fVar147 * 1.5 - fVar147 * fVar147 * auVar157._12_4_ * 0.5 * fVar147;
          fVar81 = fVar198 * fVar230 * auVar205._0_4_;
          fVar83 = fVar228 * fVar242 * auVar205._4_4_;
          fVar84 = fVar232 * fVar253 * auVar205._8_4_;
          fVar133 = fVar244 * fVar256 * auVar205._12_4_;
          fVar210 = -fVar160 * fVar230 * auVar205._0_4_;
          fVar160 = -fVar141 * fVar242 * auVar205._4_4_;
          fVar198 = -fVar177 * fVar253 * auVar205._8_4_;
          fVar228 = -fVar213 * fVar256 * auVar205._12_4_;
          fVar262 = fVar230 * 0.0 * auVar205._0_4_;
          fVar270 = fVar242 * 0.0 * auVar205._4_4_;
          fVar279 = fVar253 * 0.0 * auVar205._8_4_;
          fVar53 = fVar256 * 0.0 * auVar205._12_4_;
          fVar144 = fVar259 * fVar180 * auVar266._0_4_;
          fVar146 = fVar269 * fVar208 * auVar266._4_4_;
          fVar166 = fVar271 * fVar226 * auVar266._8_4_;
          fVar130 = fVar283 * fVar147 * auVar266._12_4_;
          fVar254 = fVar161 + fVar144;
          fVar260 = fVar176 + fVar146;
          fVar227 = fVar163 + fVar166;
          fVar229 = fVar178 + fVar130;
          fVar141 = -fVar145 * fVar180 * auVar266._0_4_;
          fVar177 = -fVar212 * fVar208 * auVar266._4_4_;
          fVar213 = -fVar148 * fVar226 * auVar266._8_4_;
          fVar203 = -fVar231 * fVar147 * auVar266._12_4_;
          fVar231 = fVar201 + fVar141;
          fVar232 = fVar202 + fVar177;
          fVar244 = fVar204 + fVar213;
          fVar255 = fVar209 + fVar203;
          fVar230 = fVar180 * 0.0 * auVar266._0_4_;
          fVar242 = fVar208 * 0.0 * auVar266._4_4_;
          fVar253 = fVar226 * 0.0 * auVar266._8_4_;
          fVar256 = fVar147 * 0.0 * auVar266._12_4_;
          fVar142 = fVar164 - fVar81;
          fVar145 = fVar179 - fVar83;
          fVar148 = fVar181 - fVar84;
          fVar212 = fVar199 - fVar133;
          fVar258 = fVar261 + fVar230;
          fVar126 = fVar112 + fVar242;
          fVar128 = fVar115 + fVar253;
          fVar129 = fVar118 + fVar256;
          fVar208 = fVar211 - fVar210;
          fVar147 = fVar243 - fVar160;
          fVar180 = fVar257 - fVar198;
          fVar226 = fVar225 - fVar228;
          fVar259 = fVar87 - fVar262;
          fVar269 = fVar114 - fVar270;
          fVar271 = fVar117 - fVar279;
          fVar283 = fVar125 - fVar53;
          uVar47 = -(uint)(0.0 < (fVar208 * (fVar258 - fVar259) - fVar259 * (fVar231 - fVar208)) *
                                 0.0 + (fVar259 * (fVar254 - fVar142) -
                                       (fVar258 - fVar259) * fVar142) * 0.0 +
                                       ((fVar231 - fVar208) * fVar142 -
                                       (fVar254 - fVar142) * fVar208));
          uVar48 = -(uint)(0.0 < (fVar147 * (fVar126 - fVar269) - fVar269 * (fVar232 - fVar147)) *
                                 0.0 + (fVar269 * (fVar260 - fVar145) -
                                       (fVar126 - fVar269) * fVar145) * 0.0 +
                                       ((fVar232 - fVar147) * fVar145 -
                                       (fVar260 - fVar145) * fVar147));
          uVar49 = -(uint)(0.0 < (fVar180 * (fVar128 - fVar271) - fVar271 * (fVar244 - fVar180)) *
                                 0.0 + (fVar271 * (fVar227 - fVar148) -
                                       (fVar128 - fVar271) * fVar148) * 0.0 +
                                       ((fVar244 - fVar180) * fVar148 -
                                       (fVar227 - fVar148) * fVar180));
          uVar50 = -(uint)(0.0 < (fVar226 * (fVar129 - fVar283) - fVar283 * (fVar255 - fVar226)) *
                                 0.0 + (fVar283 * (fVar229 - fVar212) -
                                       (fVar129 - fVar283) * fVar212) * 0.0 +
                                       ((fVar255 - fVar226) * fVar212 -
                                       (fVar229 - fVar212) * fVar226));
          fVar164 = (float)((uint)(fVar161 - fVar144) & uVar47 | ~uVar47 & (uint)(fVar164 + fVar81))
          ;
          fVar176 = (float)((uint)(fVar176 - fVar146) & uVar48 | ~uVar48 & (uint)(fVar179 + fVar83))
          ;
          fVar163 = (float)((uint)(fVar163 - fVar166) & uVar49 | ~uVar49 & (uint)(fVar181 + fVar84))
          ;
          fVar178 = (float)((uint)(fVar178 - fVar130) & uVar50 | ~uVar50 & (uint)(fVar199 + fVar133)
                           );
          fVar81 = (float)((uint)(fVar201 - fVar141) & uVar47 | ~uVar47 & (uint)(fVar211 + fVar210))
          ;
          fVar83 = (float)((uint)(fVar202 - fVar177) & uVar48 | ~uVar48 & (uint)(fVar243 + fVar160))
          ;
          fVar84 = (float)((uint)(fVar204 - fVar213) & uVar49 | ~uVar49 & (uint)(fVar257 + fVar198))
          ;
          fVar133 = (float)((uint)(fVar209 - fVar203) & uVar50 | ~uVar50 & (uint)(fVar225 + fVar228)
                           );
          fVar230 = (float)((uint)(fVar261 - fVar230) & uVar47 | ~uVar47 & (uint)(fVar87 + fVar262))
          ;
          fVar242 = (float)((uint)(fVar112 - fVar242) & uVar48 | ~uVar48 & (uint)(fVar114 + fVar270)
                           );
          fVar253 = (float)((uint)(fVar115 - fVar253) & uVar49 | ~uVar49 & (uint)(fVar117 + fVar279)
                           );
          fVar256 = (float)((uint)(fVar118 - fVar256) & uVar50 | ~uVar50 & (uint)(fVar125 + fVar53))
          ;
          fVar144 = (float)((uint)fVar142 & uVar47 | ~uVar47 & (uint)fVar254);
          fVar146 = (float)((uint)fVar145 & uVar48 | ~uVar48 & (uint)fVar260);
          fVar166 = (float)((uint)fVar148 & uVar49 | ~uVar49 & (uint)fVar227);
          fVar161 = (float)((uint)fVar212 & uVar50 | ~uVar50 & (uint)fVar229);
          fVar210 = (float)((uint)fVar208 & uVar47 | ~uVar47 & (uint)fVar231);
          fVar160 = (float)((uint)fVar147 & uVar48 | ~uVar48 & (uint)fVar232);
          fVar198 = (float)((uint)fVar180 & uVar49 | ~uVar49 & (uint)fVar244);
          fVar228 = (float)((uint)fVar226 & uVar50 | ~uVar50 & (uint)fVar255);
          fVar262 = (float)((uint)fVar259 & uVar47 | ~uVar47 & (uint)fVar258);
          fVar270 = (float)((uint)fVar269 & uVar48 | ~uVar48 & (uint)fVar126);
          fVar279 = (float)((uint)fVar271 & uVar49 | ~uVar49 & (uint)fVar128);
          fVar53 = (float)((uint)fVar283 & uVar50 | ~uVar50 & (uint)fVar129);
          fVar142 = (float)((uint)fVar254 & uVar47 | ~uVar47 & (uint)fVar142) - fVar164;
          fVar145 = (float)((uint)fVar260 & uVar48 | ~uVar48 & (uint)fVar145) - fVar176;
          fVar148 = (float)((uint)fVar227 & uVar49 | ~uVar49 & (uint)fVar148) - fVar163;
          fVar179 = (float)((uint)fVar229 & uVar50 | ~uVar50 & (uint)fVar212) - fVar178;
          fVar181 = (float)((uint)fVar231 & uVar47 | ~uVar47 & (uint)fVar208) - fVar81;
          fVar199 = (float)((uint)fVar232 & uVar48 | ~uVar48 & (uint)fVar147) - fVar83;
          fVar201 = (float)((uint)fVar244 & uVar49 | ~uVar49 & (uint)fVar180) - fVar84;
          fVar202 = (float)((uint)fVar255 & uVar50 | ~uVar50 & (uint)fVar226) - fVar133;
          fVar259 = (float)((uint)fVar258 & uVar47 | ~uVar47 & (uint)fVar259) - fVar230;
          fVar269 = (float)((uint)fVar126 & uVar48 | ~uVar48 & (uint)fVar269) - fVar242;
          fVar271 = (float)((uint)fVar128 & uVar49 | ~uVar49 & (uint)fVar271) - fVar253;
          fVar283 = (float)((uint)fVar129 & uVar50 | ~uVar50 & (uint)fVar283) - fVar256;
          fVar243 = fVar164 - fVar144;
          fVar254 = fVar176 - fVar146;
          fVar257 = fVar163 - fVar166;
          fVar260 = fVar178 - fVar161;
          fVar141 = fVar81 - fVar210;
          fVar177 = fVar83 - fVar160;
          fVar213 = fVar84 - fVar198;
          fVar203 = fVar133 - fVar228;
          fVar208 = fVar230 - fVar262;
          fVar147 = fVar242 - fVar270;
          fVar180 = fVar253 - fVar279;
          fVar226 = fVar256 - fVar53;
          fVar204 = (fVar81 * fVar259 - fVar230 * fVar181) * 0.0 +
                    (fVar230 * fVar142 - fVar164 * fVar259) * 0.0 +
                    (fVar164 * fVar181 - fVar81 * fVar142);
          fVar209 = (fVar83 * fVar269 - fVar242 * fVar199) * 0.0 +
                    (fVar242 * fVar145 - fVar176 * fVar269) * 0.0 +
                    (fVar176 * fVar199 - fVar83 * fVar145);
          auVar139._4_4_ = fVar209;
          auVar139._0_4_ = fVar204;
          fVar211 = (fVar84 * fVar271 - fVar253 * fVar201) * 0.0 +
                    (fVar253 * fVar148 - fVar163 * fVar271) * 0.0 +
                    (fVar163 * fVar201 - fVar84 * fVar148);
          fVar212 = (fVar133 * fVar283 - fVar256 * fVar202) * 0.0 +
                    (fVar256 * fVar179 - fVar178 * fVar283) * 0.0 +
                    (fVar178 * fVar202 - fVar133 * fVar179);
          auVar274._0_4_ =
               (fVar210 * fVar208 - fVar262 * fVar141) * 0.0 +
               (fVar262 * fVar243 - fVar144 * fVar208) * 0.0 +
               (fVar144 * fVar141 - fVar210 * fVar243);
          auVar274._4_4_ =
               (fVar160 * fVar147 - fVar270 * fVar177) * 0.0 +
               (fVar270 * fVar254 - fVar146 * fVar147) * 0.0 +
               (fVar146 * fVar177 - fVar160 * fVar254);
          auVar274._8_4_ =
               (fVar198 * fVar180 - fVar279 * fVar213) * 0.0 +
               (fVar279 * fVar257 - fVar166 * fVar180) * 0.0 +
               (fVar166 * fVar213 - fVar198 * fVar257);
          auVar274._12_4_ =
               (fVar228 * fVar226 - fVar53 * fVar203) * 0.0 +
               (fVar53 * fVar260 - fVar161 * fVar226) * 0.0 +
               (fVar161 * fVar203 - fVar228 * fVar260);
          auVar139._8_4_ = fVar211;
          auVar139._12_4_ = fVar212;
          auVar54 = maxps(auVar139,auVar274);
          bVar27 = auVar54._0_4_ <= 0.0 && bVar27;
          auVar140._0_4_ = -(uint)bVar27;
          bVar28 = auVar54._4_4_ <= 0.0 && bVar28;
          auVar140._4_4_ = -(uint)bVar28;
          bVar29 = auVar54._8_4_ <= 0.0 && bVar29;
          auVar140._8_4_ = -(uint)bVar29;
          bVar30 = auVar54._12_4_ <= 0.0 && bVar30;
          auVar140._12_4_ = -(uint)bVar30;
          iVar36 = movmskps((int)pauVar34,auVar140);
          if (iVar36 == 0) {
            auVar123._8_8_ = uStack_390;
            auVar123._0_8_ = local_398;
            iVar36 = 0;
          }
          else {
            fVar198 = fVar141 * fVar259 - fVar208 * fVar181;
            fVar228 = fVar177 * fVar269 - fVar147 * fVar199;
            fVar262 = fVar213 * fVar271 - fVar180 * fVar201;
            fVar270 = fVar203 * fVar283 - fVar226 * fVar202;
            fVar210 = fVar208 * fVar142 - fVar259 * fVar243;
            fVar147 = fVar147 * fVar145 - fVar269 * fVar254;
            fVar160 = fVar180 * fVar148 - fVar271 * fVar257;
            fVar180 = fVar226 * fVar179 - fVar283 * fVar260;
            fVar141 = fVar243 * fVar181 - fVar141 * fVar142;
            fVar226 = fVar254 * fVar199 - fVar177 * fVar145;
            fVar259 = fVar257 * fVar201 - fVar213 * fVar148;
            fVar269 = fVar260 * fVar202 - fVar203 * fVar179;
            auVar122._0_4_ = fVar210 * 0.0 + fVar141;
            auVar122._4_4_ = fVar147 * 0.0 + fVar226;
            auVar122._8_4_ = fVar160 * 0.0 + fVar259;
            auVar122._12_4_ = fVar180 * 0.0 + fVar269;
            auVar197._0_4_ = fVar198 * 0.0 + auVar122._0_4_;
            auVar197._4_4_ = fVar228 * 0.0 + auVar122._4_4_;
            auVar197._8_4_ = fVar262 * 0.0 + auVar122._8_4_;
            auVar197._12_4_ = fVar270 * 0.0 + auVar122._12_4_;
            auVar54 = rcpps(auVar122,auVar197);
            fVar177 = auVar54._0_4_;
            fVar213 = auVar54._4_4_;
            fVar203 = auVar54._8_4_;
            fVar208 = auVar54._12_4_;
            fVar177 = (1.0 - auVar197._0_4_ * fVar177) * fVar177 + fVar177;
            fVar213 = (1.0 - auVar197._4_4_ * fVar213) * fVar213 + fVar213;
            fVar203 = (1.0 - auVar197._8_4_ * fVar203) * fVar203 + fVar203;
            fVar208 = (1.0 - auVar197._12_4_ * fVar208) * fVar208 + fVar208;
            fVar210 = (fVar230 * fVar141 + fVar81 * fVar210 + fVar164 * fVar198) * fVar177;
            fVar147 = (fVar242 * fVar226 + fVar83 * fVar147 + fVar176 * fVar228) * fVar213;
            fVar160 = (fVar253 * fVar259 + fVar84 * fVar160 + fVar163 * fVar262) * fVar203;
            fVar180 = (fVar256 * fVar269 + fVar133 * fVar180 + fVar178 * fVar270) * fVar208;
            fVar141 = *(float *)(ray + k * 4 + 0x80);
            bVar27 = (fVar127 <= fVar210 && fVar210 <= fVar141) && bVar27;
            auVar158._0_4_ = -(uint)bVar27;
            bVar28 = (fVar127 <= fVar147 && fVar147 <= fVar141) && bVar28;
            auVar158._4_4_ = -(uint)bVar28;
            bVar29 = (fVar127 <= fVar160 && fVar160 <= fVar141) && bVar29;
            auVar158._8_4_ = -(uint)bVar29;
            bVar30 = (fVar127 <= fVar180 && fVar180 <= fVar141) && bVar30;
            auVar158._12_4_ = -(uint)bVar30;
            iVar36 = movmskps(iVar36,auVar158);
            if (iVar36 == 0) {
              auVar123._8_8_ = uStack_390;
              auVar123._0_8_ = local_398;
              iVar36 = 0;
            }
            else {
              auVar159._0_8_ =
                   CONCAT44(-(uint)(auVar197._4_4_ != 0.0 && bVar28),
                            -(uint)(auVar197._0_4_ != 0.0 && bVar27));
              auVar159._8_4_ = -(uint)(auVar197._8_4_ != 0.0 && bVar29);
              auVar159._12_4_ = -(uint)(auVar197._12_4_ != 0.0 && bVar30);
              iVar36 = movmskps(iVar36,auVar159);
              auVar123._8_8_ = uStack_390;
              auVar123._0_8_ = local_398;
              if (iVar36 != 0) {
                fVar204 = fVar204 * fVar177;
                fVar209 = fVar209 * fVar213;
                fVar211 = fVar211 * fVar203;
                fVar212 = fVar212 * fVar208;
                auVar77._0_4_ = ~uVar47 & (uint)fVar204;
                auVar77._4_4_ = ~uVar48 & (uint)fVar209;
                auVar77._8_4_ = ~uVar49 & (uint)fVar211;
                auVar77._12_4_ = ~uVar50 & (uint)fVar212;
                auVar206._0_4_ = (uint)(1.0 - fVar204) & uVar47;
                auVar206._4_4_ = (uint)(1.0 - fVar209) & uVar48;
                auVar206._8_4_ = (uint)(1.0 - fVar211) & uVar49;
                auVar206._12_4_ = (uint)(1.0 - fVar212) & uVar50;
                aVar207 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar206 | auVar77);
                local_288 = (float)(~uVar47 & (uint)(auVar274._0_4_ * fVar177) |
                                   (uint)(1.0 - auVar274._0_4_ * fVar177) & uVar47);
                fStack_284 = (float)(~uVar48 & (uint)(auVar274._4_4_ * fVar213) |
                                    (uint)(1.0 - auVar274._4_4_ * fVar213) & uVar48);
                fStack_280 = (float)(~uVar49 & (uint)(auVar274._8_4_ * fVar203) |
                                    (uint)(1.0 - auVar274._8_4_ * fVar203) & uVar49);
                fStack_27c = (float)(~uVar50 & (uint)(auVar274._12_4_ * fVar208) |
                                    (uint)(1.0 - auVar274._12_4_ * fVar208) & uVar50);
                auVar123._8_4_ = auVar159._8_4_;
                auVar123._0_8_ = auVar159._0_8_;
                auVar123._12_4_ = auVar159._12_4_;
                fVar233 = fVar210;
                fVar236 = fVar147;
                fVar238 = fVar160;
                fVar240 = fVar180;
              }
            }
          }
          uVar38 = uVar43 & 0xffffffff;
          uVar47 = movmskps(iVar36,auVar123);
          pauVar34 = (undefined1 (*) [16])(ulong)uVar47;
          if (uVar47 != 0) {
            fVar177 = (auVar266._0_4_ - auVar205._0_4_) * aVar207.v[0] + auVar205._0_4_;
            fVar213 = (auVar266._4_4_ - auVar205._4_4_) * aVar207.v[1] + auVar205._4_4_;
            fVar203 = (auVar266._8_4_ - auVar205._8_4_) * aVar207.v[2] + auVar205._8_4_;
            fVar208 = (auVar266._12_4_ - auVar205._12_4_) * aVar207.v[3] + auVar205._12_4_;
            fVar141 = *(float *)((long)local_330->ray_space + k * 4 + -0x10);
            bhit.valid.field_0._0_4_ =
                 -(uint)(fVar141 * (fVar177 + fVar177) < fVar233) & auVar123._0_4_;
            bhit.valid.field_0._4_4_ =
                 -(uint)(fVar141 * (fVar213 + fVar213) < fVar236) & auVar123._4_4_;
            bhit.valid.field_0._8_4_ =
                 -(uint)(fVar141 * (fVar203 + fVar203) < fVar238) & auVar123._8_4_;
            bhit.valid.field_0._12_4_ =
                 -(uint)(fVar141 * (fVar208 + fVar208) < fVar240) & auVar123._12_4_;
            uVar47 = movmskps((int)local_330,(undefined1  [16])bhit.valid.field_0);
            pauVar34 = (undefined1 (*) [16])(ulong)uVar47;
            if (uVar47 != 0) {
              local_288 = local_288 + local_288 + -1.0;
              fStack_284 = fStack_284 + fStack_284 + -1.0;
              fStack_280 = fStack_280 + fStack_280 + -1.0;
              fStack_27c = fStack_27c + fStack_27c + -1.0;
              bhit.T.field_0.v[1] = fVar236;
              bhit.T.field_0.v[0] = fVar233;
              bhit.T.field_0.v[2] = fVar238;
              bhit.T.field_0.v[3] = fVar240;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fStack_384,local_388);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fStack_37c,fStack_380);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fStack_344,local_348);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fStack_33c,fStack_340);
              pGVar39 = (context->scene->geometries).items[local_3a0].ptr;
              if ((pGVar39->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                bVar35 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar35 = 1, pGVar39->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar141 = (float)bhit.i;
                bhit.vu.field_0.v[0] = (fVar141 + aVar207.v[0] + 0.0) * local_88;
                bhit.vu.field_0.v[1] = (fVar141 + aVar207.v[1] + 1.0) * fStack_84;
                bhit.vu.field_0.v[2] = (fVar141 + aVar207.v[2] + 2.0) * fStack_80;
                bhit.vu.field_0.v[3] = (fVar141 + aVar207.v[3] + 3.0) * fStack_7c;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_284,local_288);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_27c,fStack_280);
                bhit.vt.field_0.v[1] = fVar236;
                bhit.vt.field_0.v[0] = fVar233;
                bhit.vt.field_0.v[2] = fVar238;
                bhit.vt.field_0.v[3] = fVar240;
                uVar42 = (ulong)(byte)uVar47;
                uVar38 = 0;
                if (uVar42 != 0) {
                  for (; ((byte)uVar47 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                  }
                }
                auVar54 = *local_338;
                fVar141 = local_388;
                fVar177 = fStack_384;
                fVar213 = fStack_380;
                bhit.U.field_0 = aVar207;
                bhit.V.field_0.v[0] = local_288;
                bhit.V.field_0.v[1] = fStack_284;
                bhit.V.field_0.v[2] = fStack_280;
                bhit.V.field_0.v[3] = fStack_27c;
                bhit.N = iVar6;
                bhit.curve3D.v2.field_0.m128[0] = fVar80;
                bhit.curve3D.v2.field_0.m128[1] = fVar82;
                bhit.curve3D.v2.field_0.m128[2] = fVar86;
                bhit.curve3D.v2.field_0.m128[3] = fVar111;
                bhit.curve3D.v3.field_0._0_8_ = uVar8;
                bhit.curve3D.v3.field_0._8_8_ = uVar31;
                while (uVar42 != 0) {
                  local_e8._4_4_ = bhit.vu.field_0.v[uVar38];
                  uVar46 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = bhit.vv.field_0.v[uVar38];
                  *(float *)(ray + k * 4 + 0x80) = bhit.vt.field_0.v[uVar38];
                  fVar147 = 1.0 - (float)local_e8._4_4_;
                  fVar203 = (float)local_e8._4_4_ * fVar147 * 4.0;
                  fVar160 = (fVar147 * fVar147 + fVar203) * 0.5;
                  fVar208 = (float)local_e8._4_4_ * (float)local_e8._4_4_ * 0.5;
                  fVar210 = (-(float)local_e8._4_4_ * (float)local_e8._4_4_ - fVar203) * 0.5;
                  args.context = context->user;
                  fVar203 = -fVar147 * fVar147 * 0.5;
                  local_118 = fVar203 * fVar141 +
                              fVar210 * local_348 + fVar160 * fVar80 + fVar208 * fVar113;
                  local_108 = fVar203 * fVar177 +
                              fVar210 * fStack_344 + fVar160 * fVar82 + fVar208 * fVar116;
                  local_f8 = fVar203 * fVar213 +
                             fVar210 * fStack_340 + fVar160 * fVar86 + fVar208 * fVar124;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  local_e8._0_4_ = local_e8._4_4_;
                  fStack_e0 = (float)local_e8._4_4_;
                  fStack_dc = (float)local_e8._4_4_;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_c8 = local_2f8;
                  uStack_c0 = uStack_2f0;
                  local_b8 = CONCAT44(uStack_74,local_78);
                  uStack_b0 = CONCAT44(uStack_6c,uStack_70);
                  local_a8 = (args.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (args.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  args.valid = (int *)local_3b8;
                  args.geometryUserPtr = pGVar39->userPtr;
                  args.hit = (RTCHitN *)&local_118;
                  args.N = 4;
                  p_Var32 = pGVar39->occlusionFilterN;
                  local_3b8 = auVar54;
                  args.ray = (RTCRayN *)ray;
                  if (p_Var32 != (RTCFilterFunctionN)0x0) {
                    p_Var32 = (RTCFilterFunctionN)(*p_Var32)(&args);
                    fVar141 = local_388;
                    fVar177 = fStack_384;
                    fVar213 = fStack_380;
                  }
                  auVar108._0_4_ = -(uint)(local_3b8._0_4_ == 0);
                  auVar108._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                  auVar108._8_4_ = -(uint)(local_3b8._8_4_ == 0);
                  auVar108._12_4_ = -(uint)(local_3b8._12_4_ == 0);
                  uVar47 = movmskps((int)p_Var32,auVar108);
                  pRVar33 = (RTCRayN *)(ulong)(uVar47 ^ 0xf);
                  if ((uVar47 ^ 0xf) == 0) {
                    auVar108 = auVar108 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var32 = context->args->filter;
                    if ((p_Var32 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar39->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var32)(&args);
                      fVar141 = local_388;
                      fVar177 = fStack_384;
                      fVar213 = fStack_380;
                    }
                    auVar78._0_4_ = -(uint)(local_3b8._0_4_ == 0);
                    auVar78._4_4_ = -(uint)(local_3b8._4_4_ == 0);
                    auVar78._8_4_ = -(uint)(local_3b8._8_4_ == 0);
                    auVar78._12_4_ = -(uint)(local_3b8._12_4_ == 0);
                    auVar108 = auVar78 ^ _DAT_01f46b70;
                    *(undefined1 (*) [16])(args.ray + 0x80) =
                         ~auVar78 & _DAT_01f45a40 |
                         *(undefined1 (*) [16])(args.ray + 0x80) & auVar78;
                    pRVar33 = args.ray;
                  }
                  auVar109._0_4_ = auVar108._0_4_ << 0x1f;
                  auVar109._4_4_ = auVar108._4_4_ << 0x1f;
                  auVar109._8_4_ = auVar108._8_4_ << 0x1f;
                  auVar109._12_4_ = auVar108._12_4_ << 0x1f;
                  iVar36 = movmskps((int)pRVar33,auVar109);
                  if (iVar36 != 0) {
                    bVar35 = 1;
                    goto LAB_0033d7a2;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar46;
                  uVar42 = uVar42 ^ 1L << (uVar38 & 0x3f);
                  uVar38 = 0;
                  if (uVar42 != 0) {
                    for (; (uVar42 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
                    }
                  }
                }
                bVar35 = 0;
              }
LAB_0033d7a2:
              uVar47 = CONCAT31((int3)(uVar43 >> 8),(byte)uVar43 | bVar35);
              pauVar34 = (undefined1 (*) [16])(ulong)uVar47;
              uVar38 = (ulong)uVar47;
            }
          }
        }
        uVar43 = uVar38;
      }
    }
    if ((uVar43 & 1) != 0) break;
    fVar143 = *(float *)(ray + k * 4 + 0x80);
    auVar107._4_4_ = -(uint)(fStack_44 <= fVar143);
    auVar107._0_4_ = -(uint)(local_48 <= fVar143);
    auVar107._8_4_ = -(uint)(fStack_40 <= fVar143);
    auVar107._12_4_ = -(uint)(fStack_3c <= fVar143);
    uVar47 = movmskps(uVar46,auVar107);
    uVar45 = (ulong)((uint)uVar44 & uVar47);
  }
  return uVar45 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }